

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Geometry *pGVar1;
  RTCFilterFunctionN p_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [12];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  byte bVar59;
  byte bVar60;
  byte bVar61;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  byte bVar62;
  ulong uVar63;
  byte bVar64;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  ulong uVar65;
  ulong uVar66;
  undefined8 unaff_R13;
  bool bVar67;
  uint uVar68;
  uint uVar129;
  uint uVar130;
  uint uVar132;
  uint uVar133;
  uint uVar134;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  uint uVar131;
  uint uVar135;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float pp;
  float fVar136;
  float fVar137;
  float fVar152;
  float fVar153;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar169 [16];
  undefined1 auVar173 [32];
  float fVar174;
  float fVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar198;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar205 [32];
  undefined1 auVar209 [16];
  float fVar216;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar220;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  float fVar226;
  undefined1 auVar227 [32];
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar228 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [28];
  float fVar235;
  undefined1 auVar236 [64];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_a40;
  undefined1 local_890 [16];
  ulong local_878;
  uint local_870;
  uint local_86c;
  float local_868;
  float local_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  Primitive *local_780;
  ulong local_778;
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  ulong local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 auStack_590 [16];
  undefined1 local_580 [32];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  RTCHitN local_520 [16];
  undefined1 auStack_510 [16];
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  float local_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [16];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  uint local_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint uStack_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar242 [64];
  
  uVar65 = (ulong)(byte)prim[1];
  fVar226 = *(float *)(prim + uVar65 * 0x19 + 0x12);
  auVar71 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar71 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar72 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar75 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar76 = vsubps_avx(auVar71,*(undefined1 (*) [16])(prim + uVar65 * 0x19 + 6));
  fVar198 = fVar226 * auVar76._0_4_;
  fVar136 = fVar226 * auVar75._0_4_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar65 * 4 + 6);
  auVar87 = vpmovsxbd_avx2(auVar71);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar65 * 5 + 6);
  auVar84 = vpmovsxbd_avx2(auVar72);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar65 * 6 + 6);
  auVar85 = vpmovsxbd_avx2(auVar79);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar65 * 0xb + 6);
  auVar88 = vpmovsxbd_avx2(auVar73);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar65 * 0xc + 6);
  auVar89 = vpmovsxbd_avx2(auVar69);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar65 * 0xd + 6);
  auVar86 = vpmovsxbd_avx2(auVar78);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar65 * 0x12 + 6);
  auVar90 = vpmovsxbd_avx2(auVar77);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar65 * 0x13 + 6);
  auVar93 = vpmovsxbd_avx2(auVar70);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar91 = vcvtdq2ps_avx(auVar93);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar65 * 0x14 + 6);
  auVar82 = vpmovsxbd_avx2(auVar74);
  auVar92 = vcvtdq2ps_avx(auVar82);
  auVar101._4_4_ = fVar136;
  auVar101._0_4_ = fVar136;
  auVar101._8_4_ = fVar136;
  auVar101._12_4_ = fVar136;
  auVar101._16_4_ = fVar136;
  auVar101._20_4_ = fVar136;
  auVar101._24_4_ = fVar136;
  auVar101._28_4_ = fVar136;
  auVar103._8_4_ = 1;
  auVar103._0_8_ = 0x100000001;
  auVar103._12_4_ = 1;
  auVar103._16_4_ = 1;
  auVar103._20_4_ = 1;
  auVar103._24_4_ = 1;
  auVar103._28_4_ = 1;
  auVar94 = ZEXT1632(CONCAT412(fVar226 * auVar75._12_4_,
                               CONCAT48(fVar226 * auVar75._8_4_,
                                        CONCAT44(fVar226 * auVar75._4_4_,fVar136))));
  auVar83 = vpermps_avx2(auVar103,auVar94);
  auVar80 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar81 = vpermps_avx512vl(auVar80,auVar94);
  fVar136 = auVar81._0_4_;
  fVar229 = auVar81._4_4_;
  auVar94._4_4_ = fVar229 * auVar85._4_4_;
  auVar94._0_4_ = fVar136 * auVar85._0_4_;
  fVar230 = auVar81._8_4_;
  auVar94._8_4_ = fVar230 * auVar85._8_4_;
  fVar231 = auVar81._12_4_;
  auVar94._12_4_ = fVar231 * auVar85._12_4_;
  fVar206 = auVar81._16_4_;
  auVar94._16_4_ = fVar206 * auVar85._16_4_;
  fVar207 = auVar81._20_4_;
  auVar94._20_4_ = fVar207 * auVar85._20_4_;
  fVar208 = auVar81._24_4_;
  auVar94._24_4_ = fVar208 * auVar85._24_4_;
  auVar94._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar86._4_4_ * fVar229;
  auVar93._0_4_ = auVar86._0_4_ * fVar136;
  auVar93._8_4_ = auVar86._8_4_ * fVar230;
  auVar93._12_4_ = auVar86._12_4_ * fVar231;
  auVar93._16_4_ = auVar86._16_4_ * fVar206;
  auVar93._20_4_ = auVar86._20_4_ * fVar207;
  auVar93._24_4_ = auVar86._24_4_ * fVar208;
  auVar93._28_4_ = auVar82._28_4_;
  auVar82._4_4_ = auVar92._4_4_ * fVar229;
  auVar82._0_4_ = auVar92._0_4_ * fVar136;
  auVar82._8_4_ = auVar92._8_4_ * fVar230;
  auVar82._12_4_ = auVar92._12_4_ * fVar231;
  auVar82._16_4_ = auVar92._16_4_ * fVar206;
  auVar82._20_4_ = auVar92._20_4_ * fVar207;
  auVar82._24_4_ = auVar92._24_4_ * fVar208;
  auVar82._28_4_ = auVar81._28_4_;
  auVar71 = vfmadd231ps_fma(auVar94,auVar83,auVar84);
  auVar72 = vfmadd231ps_fma(auVar93,auVar83,auVar89);
  auVar79 = vfmadd231ps_fma(auVar82,auVar91,auVar83);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar101,auVar87);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar101,auVar88);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar90,auVar101);
  auVar102._4_4_ = fVar198;
  auVar102._0_4_ = fVar198;
  auVar102._8_4_ = fVar198;
  auVar102._12_4_ = fVar198;
  auVar102._16_4_ = fVar198;
  auVar102._20_4_ = fVar198;
  auVar102._24_4_ = fVar198;
  auVar102._28_4_ = fVar198;
  auVar82 = ZEXT1632(CONCAT412(fVar226 * auVar76._12_4_,
                               CONCAT48(fVar226 * auVar76._8_4_,
                                        CONCAT44(fVar226 * auVar76._4_4_,fVar198))));
  auVar93 = vpermps_avx2(auVar103,auVar82);
  auVar82 = vpermps_avx512vl(auVar80,auVar82);
  auVar83 = vmulps_avx512vl(auVar82,auVar85);
  auVar96._0_4_ = auVar82._0_4_ * auVar86._0_4_;
  auVar96._4_4_ = auVar82._4_4_ * auVar86._4_4_;
  auVar96._8_4_ = auVar82._8_4_ * auVar86._8_4_;
  auVar96._12_4_ = auVar82._12_4_ * auVar86._12_4_;
  auVar96._16_4_ = auVar82._16_4_ * auVar86._16_4_;
  auVar96._20_4_ = auVar82._20_4_ * auVar86._20_4_;
  auVar96._24_4_ = auVar82._24_4_ * auVar86._24_4_;
  auVar96._28_4_ = 0;
  auVar86._4_4_ = auVar82._4_4_ * auVar92._4_4_;
  auVar86._0_4_ = auVar82._0_4_ * auVar92._0_4_;
  auVar86._8_4_ = auVar82._8_4_ * auVar92._8_4_;
  auVar86._12_4_ = auVar82._12_4_ * auVar92._12_4_;
  auVar86._16_4_ = auVar82._16_4_ * auVar92._16_4_;
  auVar86._20_4_ = auVar82._20_4_ * auVar92._20_4_;
  auVar86._24_4_ = auVar82._24_4_ * auVar92._24_4_;
  auVar86._28_4_ = auVar85._28_4_;
  auVar84 = vfmadd231ps_avx512vl(auVar83,auVar93,auVar84);
  auVar73 = vfmadd231ps_fma(auVar96,auVar93,auVar89);
  auVar69 = vfmadd231ps_fma(auVar86,auVar93,auVar91);
  auVar84 = vfmadd231ps_avx512vl(auVar84,auVar102,auVar87);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar102,auVar88);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar102,auVar90);
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  auVar98._16_4_ = 0x7fffffff;
  auVar98._20_4_ = 0x7fffffff;
  auVar98._24_4_ = 0x7fffffff;
  auVar98._28_4_ = 0x7fffffff;
  auVar87 = vandps_avx(ZEXT1632(auVar71),auVar98);
  auVar100._8_4_ = 0x219392ef;
  auVar100._0_8_ = 0x219392ef219392ef;
  auVar100._12_4_ = 0x219392ef;
  auVar100._16_4_ = 0x219392ef;
  auVar100._20_4_ = 0x219392ef;
  auVar100._24_4_ = 0x219392ef;
  auVar100._28_4_ = 0x219392ef;
  uVar63 = vcmpps_avx512vl(auVar87,auVar100,1);
  bVar67 = (bool)((byte)uVar63 & 1);
  auVar83._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar71._0_4_;
  bVar67 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar71._4_4_;
  bVar67 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar71._8_4_;
  bVar67 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar71._12_4_;
  auVar83._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * 0x219392ef;
  auVar83._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * 0x219392ef;
  auVar83._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * 0x219392ef;
  auVar83._28_4_ = (uint)(byte)(uVar63 >> 7) * 0x219392ef;
  auVar87 = vandps_avx(ZEXT1632(auVar72),auVar98);
  uVar63 = vcmpps_avx512vl(auVar87,auVar100,1);
  bVar67 = (bool)((byte)uVar63 & 1);
  auVar80._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar72._0_4_;
  bVar67 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar72._4_4_;
  bVar67 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar72._8_4_;
  bVar67 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar72._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * 0x219392ef;
  auVar80._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * 0x219392ef;
  auVar80._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * 0x219392ef;
  auVar80._28_4_ = (uint)(byte)(uVar63 >> 7) * 0x219392ef;
  auVar87 = vandps_avx(ZEXT1632(auVar79),auVar98);
  uVar63 = vcmpps_avx512vl(auVar87,auVar100,1);
  bVar67 = (bool)((byte)uVar63 & 1);
  auVar87._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar79._0_4_;
  bVar67 = (bool)((byte)(uVar63 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar79._4_4_;
  bVar67 = (bool)((byte)(uVar63 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar79._8_4_;
  bVar67 = (bool)((byte)(uVar63 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar79._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar63 >> 7) * 0x219392ef;
  auVar85 = vrcp14ps_avx512vl(auVar83);
  auVar99._8_4_ = 0x3f800000;
  auVar99._0_8_ = 0x3f8000003f800000;
  auVar99._12_4_ = 0x3f800000;
  auVar99._16_4_ = 0x3f800000;
  auVar99._20_4_ = 0x3f800000;
  auVar99._24_4_ = 0x3f800000;
  auVar99._28_4_ = 0x3f800000;
  auVar71 = vfnmadd213ps_fma(auVar83,auVar85,auVar99);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar80);
  auVar72 = vfnmadd213ps_fma(auVar80,auVar85,auVar99);
  auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar87);
  auVar79 = vfnmadd213ps_fma(auVar87,auVar85,auVar99);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 7 + 6));
  auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar85,auVar85);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar85 = vsubps_avx512vl(auVar87,auVar84);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 9 + 6));
  auVar90._4_4_ = auVar71._4_4_ * auVar85._4_4_;
  auVar90._0_4_ = auVar71._0_4_ * auVar85._0_4_;
  auVar90._8_4_ = auVar71._8_4_ * auVar85._8_4_;
  auVar90._12_4_ = auVar71._12_4_ * auVar85._12_4_;
  auVar90._16_4_ = auVar85._16_4_ * 0.0;
  auVar90._20_4_ = auVar85._20_4_ * 0.0;
  auVar90._24_4_ = auVar85._24_4_ * 0.0;
  auVar90._28_4_ = auVar85._28_4_;
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar84 = vsubps_avx512vl(auVar87,auVar84);
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 0xe + 6));
  auVar97._0_4_ = auVar71._0_4_ * auVar84._0_4_;
  auVar97._4_4_ = auVar71._4_4_ * auVar84._4_4_;
  auVar97._8_4_ = auVar71._8_4_ * auVar84._8_4_;
  auVar97._12_4_ = auVar71._12_4_ * auVar84._12_4_;
  auVar97._16_4_ = auVar84._16_4_ * 0.0;
  auVar97._20_4_ = auVar84._20_4_ * 0.0;
  auVar97._24_4_ = auVar84._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar73));
  auVar91._4_4_ = auVar72._4_4_ * auVar87._4_4_;
  auVar91._0_4_ = auVar72._0_4_ * auVar87._0_4_;
  auVar91._8_4_ = auVar72._8_4_ * auVar87._8_4_;
  auVar91._12_4_ = auVar72._12_4_ * auVar87._12_4_;
  auVar91._16_4_ = auVar87._16_4_ * 0.0;
  auVar91._20_4_ = auVar87._20_4_ * 0.0;
  auVar91._24_4_ = auVar87._24_4_ * 0.0;
  auVar91._28_4_ = auVar87._28_4_;
  auVar86 = vpbroadcastd_avx512vl();
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar73));
  auVar95._0_4_ = auVar72._0_4_ * auVar87._0_4_;
  auVar95._4_4_ = auVar72._4_4_ * auVar87._4_4_;
  auVar95._8_4_ = auVar72._8_4_ * auVar87._8_4_;
  auVar95._12_4_ = auVar72._12_4_ * auVar87._12_4_;
  auVar95._16_4_ = auVar87._16_4_ * 0.0;
  auVar95._20_4_ = auVar87._20_4_ * 0.0;
  auVar95._24_4_ = auVar87._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 0x15 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar69));
  auVar92._4_4_ = auVar87._4_4_ * auVar79._4_4_;
  auVar92._0_4_ = auVar87._0_4_ * auVar79._0_4_;
  auVar92._8_4_ = auVar87._8_4_ * auVar79._8_4_;
  auVar92._12_4_ = auVar87._12_4_ * auVar79._12_4_;
  auVar92._16_4_ = auVar87._16_4_ * 0.0;
  auVar92._20_4_ = auVar87._20_4_ * 0.0;
  auVar92._24_4_ = auVar87._24_4_ * 0.0;
  auVar92._28_4_ = auVar87._28_4_;
  auVar87 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar65 * 0x17 + 6));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar69));
  auVar81._0_4_ = auVar79._0_4_ * auVar87._0_4_;
  auVar81._4_4_ = auVar79._4_4_ * auVar87._4_4_;
  auVar81._8_4_ = auVar79._8_4_ * auVar87._8_4_;
  auVar81._12_4_ = auVar79._12_4_ * auVar87._12_4_;
  auVar81._16_4_ = auVar87._16_4_ * 0.0;
  auVar81._20_4_ = auVar87._20_4_ * 0.0;
  auVar81._24_4_ = auVar87._24_4_ * 0.0;
  auVar81._28_4_ = 0;
  auVar87 = vpminsd_avx2(auVar90,auVar97);
  auVar84 = vpminsd_avx2(auVar91,auVar95);
  auVar87 = vmaxps_avx(auVar87,auVar84);
  auVar84 = vpminsd_avx2(auVar92,auVar81);
  uVar158 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar85._4_4_ = uVar158;
  auVar85._0_4_ = uVar158;
  auVar85._8_4_ = uVar158;
  auVar85._12_4_ = uVar158;
  auVar85._16_4_ = uVar158;
  auVar85._20_4_ = uVar158;
  auVar85._24_4_ = uVar158;
  auVar85._28_4_ = uVar158;
  auVar84 = vmaxps_avx512vl(auVar84,auVar85);
  auVar87 = vmaxps_avx(auVar87,auVar84);
  auVar84._8_4_ = 0x3f7ffffa;
  auVar84._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar84._12_4_ = 0x3f7ffffa;
  auVar84._16_4_ = 0x3f7ffffa;
  auVar84._20_4_ = 0x3f7ffffa;
  auVar84._24_4_ = 0x3f7ffffa;
  auVar84._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar87,auVar84);
  auVar87 = vpmaxsd_avx2(auVar90,auVar97);
  auVar84 = vpmaxsd_avx2(auVar91,auVar95);
  auVar87 = vminps_avx(auVar87,auVar84);
  auVar84 = vpmaxsd_avx2(auVar92,auVar81);
  uVar158 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar88._4_4_ = uVar158;
  auVar88._0_4_ = uVar158;
  auVar88._8_4_ = uVar158;
  auVar88._12_4_ = uVar158;
  auVar88._16_4_ = uVar158;
  auVar88._20_4_ = uVar158;
  auVar88._24_4_ = uVar158;
  auVar88._28_4_ = uVar158;
  auVar84 = vminps_avx512vl(auVar84,auVar88);
  auVar87 = vminps_avx(auVar87,auVar84);
  auVar89._8_4_ = 0x3f800003;
  auVar89._0_8_ = 0x3f8000033f800003;
  auVar89._12_4_ = 0x3f800003;
  auVar89._16_4_ = 0x3f800003;
  auVar89._20_4_ = 0x3f800003;
  auVar89._24_4_ = 0x3f800003;
  auVar89._28_4_ = 0x3f800003;
  auVar87 = vmulps_avx512vl(auVar87,auVar89);
  uVar12 = vcmpps_avx512vl(local_300,auVar87,2);
  uVar14 = vpcmpgtd_avx512vl(auVar86,_DAT_01fb4ba0);
  local_778 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar12 & (byte)uVar14));
  local_550 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_780 = prim;
LAB_01a9b871:
  if (local_778 == 0) {
LAB_01a9e215:
    return local_778 != 0;
  }
  lVar16 = 0;
  for (uVar63 = local_778; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    lVar16 = lVar16 + 1;
  }
  local_878 = (ulong)*(uint *)(prim + 2);
  pGVar1 = (context->scene->geometries).items[local_878].ptr;
  uVar63 = (ulong)*(uint *)(*(long *)&pGVar1->field_0x58 +
                           pGVar1[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar16 * 4 + 6));
  p_Var2 = pGVar1[1].intersectionFilterN;
  lVar16 = *(long *)&pGVar1[1].time_range.upper;
  auVar71 = *(undefined1 (*) [16])(lVar16 + (long)p_Var2 * uVar63);
  auVar72 = *(undefined1 (*) [16])(lVar16 + (uVar63 + 1) * (long)p_Var2);
  auVar79 = *(undefined1 (*) [16])(lVar16 + (uVar63 + 2) * (long)p_Var2);
  local_608 = local_778 - 1 & local_778;
  auVar73 = *(undefined1 (*) [16])(lVar16 + (uVar63 + 3) * (long)p_Var2);
  if (local_608 != 0) {
    uVar65 = local_608 - 1 & local_608;
    for (uVar63 = local_608; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
    }
    if (uVar65 != 0) {
      for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar69 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar78 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar158 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar237._4_4_ = uVar158;
  auVar237._0_4_ = uVar158;
  auVar237._8_4_ = uVar158;
  auVar237._12_4_ = uVar158;
  local_440._16_4_ = uVar158;
  local_440._0_16_ = auVar237;
  local_440._20_4_ = uVar158;
  local_440._24_4_ = uVar158;
  local_440._28_4_ = uVar158;
  auVar242 = ZEXT3264(local_440);
  uVar158 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar243._4_4_ = uVar158;
  auVar243._0_4_ = uVar158;
  auVar243._8_4_ = uVar158;
  auVar243._12_4_ = uVar158;
  local_460._16_4_ = uVar158;
  local_460._0_16_ = auVar243;
  local_460._20_4_ = uVar158;
  local_460._24_4_ = uVar158;
  local_460._28_4_ = uVar158;
  auVar69 = vunpcklps_avx(auVar237,auVar243);
  fVar226 = *(float *)(ray + k * 4 + 0x60);
  auVar244._4_4_ = fVar226;
  auVar244._0_4_ = fVar226;
  auVar244._8_4_ = fVar226;
  auVar244._12_4_ = fVar226;
  local_480._16_4_ = fVar226;
  local_480._0_16_ = auVar244;
  local_480._20_4_ = fVar226;
  local_480._24_4_ = fVar226;
  local_480._28_4_ = fVar226;
  local_6f0 = vinsertps_avx(auVar69,auVar244,0x28);
  auVar232 = ZEXT1664(local_6f0);
  auVar76._0_4_ = auVar71._0_4_ + auVar72._0_4_ + auVar79._0_4_ + auVar73._0_4_;
  auVar76._4_4_ = auVar71._4_4_ + auVar72._4_4_ + auVar79._4_4_ + auVar73._4_4_;
  auVar76._8_4_ = auVar71._8_4_ + auVar72._8_4_ + auVar79._8_4_ + auVar73._8_4_;
  auVar76._12_4_ = auVar71._12_4_ + auVar72._12_4_ + auVar79._12_4_ + auVar73._12_4_;
  auVar75._8_4_ = 0x3e800000;
  auVar75._0_8_ = 0x3e8000003e800000;
  auVar75._12_4_ = 0x3e800000;
  auVar69 = vmulps_avx512vl(auVar76,auVar75);
  auVar69 = vsubps_avx(auVar69,auVar78);
  auVar69 = vdpps_avx(auVar69,local_6f0,0x7f);
  fVar136 = *(float *)(ray + k * 4 + 0x30);
  local_700 = vdpps_avx(local_6f0,local_6f0,0x7f);
  auVar236 = ZEXT1664(local_700);
  auVar221._4_12_ = ZEXT812(0) << 0x20;
  auVar221._0_4_ = local_700._0_4_;
  auVar70 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar221);
  auVar77 = vfnmadd213ss_fma(auVar70,local_700,ZEXT416(0x40000000));
  local_2e0 = auVar69._0_4_ * auVar70._0_4_ * auVar77._0_4_;
  auVar222._4_4_ = local_2e0;
  auVar222._0_4_ = local_2e0;
  auVar222._8_4_ = local_2e0;
  auVar222._12_4_ = local_2e0;
  fStack_3f0 = local_2e0;
  _local_400 = auVar222;
  fStack_3ec = local_2e0;
  fStack_3e8 = local_2e0;
  fStack_3e4 = local_2e0;
  auVar69 = vfmadd231ps_fma(auVar78,local_6f0,auVar222);
  auVar69 = vblendps_avx(auVar69,ZEXT816(0) << 0x40,8);
  auVar71 = vsubps_avx(auVar71,auVar69);
  auVar79 = vsubps_avx(auVar79,auVar69);
  auVar225 = ZEXT1664(auVar79);
  auVar72 = vsubps_avx(auVar72,auVar69);
  auVar228 = ZEXT1664(auVar72);
  auVar73 = vsubps_avx(auVar73,auVar69);
  auVar87 = vbroadcastss_avx512vl(auVar71);
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  local_680 = ZEXT1632(auVar71);
  auVar84 = vpermps_avx512vl(auVar105,local_680);
  auVar106._8_4_ = 2;
  auVar106._0_8_ = 0x200000002;
  auVar106._12_4_ = 2;
  auVar106._16_4_ = 2;
  auVar106._20_4_ = 2;
  auVar106._24_4_ = 2;
  auVar106._28_4_ = 2;
  auVar85 = vpermps_avx512vl(auVar106,local_680);
  auVar107._8_4_ = 3;
  auVar107._0_8_ = 0x300000003;
  auVar107._12_4_ = 3;
  auVar107._16_4_ = 3;
  auVar107._20_4_ = 3;
  auVar107._24_4_ = 3;
  auVar107._28_4_ = 3;
  auVar88 = vpermps_avx512vl(auVar107,local_680);
  auVar89 = vbroadcastss_avx512vl(auVar72);
  local_6c0 = ZEXT1632(auVar72);
  auVar86 = vpermps_avx512vl(auVar105,local_6c0);
  auVar90 = vpermps_avx512vl(auVar106,local_6c0);
  auVar91 = vpermps_avx512vl(auVar107,local_6c0);
  local_820 = vbroadcastss_avx512vl(auVar79);
  auVar246 = ZEXT3264(local_820);
  local_6a0 = ZEXT1632(auVar79);
  local_840 = vpermps_avx512vl(auVar105,local_6a0);
  auVar247 = ZEXT3264(local_840);
  local_860 = vpermps_avx512vl(auVar106,local_6a0);
  auVar248 = ZEXT3264(local_860);
  auVar92 = vpermps_avx512vl(auVar107,local_6a0);
  local_260 = vbroadcastss_avx512vl(auVar73);
  _local_6e0 = ZEXT1632(auVar73);
  local_240 = vpermps_avx512vl(auVar105,_local_6e0);
  local_2a0 = vpermps_avx2(auVar106,_local_6e0);
  local_2c0 = vpermps_avx2(auVar107,_local_6e0);
  auVar71 = vfmadd231ps_fma(ZEXT432((uint)(fVar226 * fVar226)),local_460,local_460);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),local_440,local_440);
  local_220._0_4_ = auVar71._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar104._8_4_ = 0x7fffffff;
  auVar104._0_8_ = 0x7fffffff7fffffff;
  auVar104._12_4_ = 0x7fffffff;
  auVar104._16_4_ = 0x7fffffff;
  auVar104._20_4_ = 0x7fffffff;
  auVar104._24_4_ = 0x7fffffff;
  auVar104._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar104);
  local_660 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar136 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_530 = vpbroadcastd_avx512vl();
  uVar63 = 0;
  bVar61 = 0;
  local_a40 = 1;
  local_540 = vpbroadcastd_avx512vl();
  auVar71 = vsqrtss_avx(local_700,local_700);
  local_864 = auVar71._0_4_;
  auVar71 = vsqrtss_avx(local_700,local_700);
  local_868 = auVar71._0_4_;
  local_390 = ZEXT816(0x3f80000000000000);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar250 = ZEXT3264(auVar93);
  auVar219 = ZEXT3264(_DAT_01f7b040);
  local_280 = local_240;
  do {
    auVar71 = vmovshdup_avx(local_390);
    auVar71 = vsubps_avx(auVar71,local_390);
    auVar138._0_4_ = auVar71._0_4_;
    fVar11 = auVar138._0_4_ * 0.04761905;
    uVar158 = local_390._0_4_;
    auVar213._4_4_ = uVar158;
    auVar213._0_4_ = uVar158;
    auVar213._8_4_ = uVar158;
    auVar213._12_4_ = uVar158;
    auVar213._16_4_ = uVar158;
    auVar213._20_4_ = uVar158;
    auVar213._24_4_ = uVar158;
    auVar213._28_4_ = uVar158;
    auVar138._4_4_ = auVar138._0_4_;
    auVar138._8_4_ = auVar138._0_4_;
    auVar138._12_4_ = auVar138._0_4_;
    local_720._16_4_ = auVar138._0_4_;
    local_720._0_16_ = auVar138;
    local_720._20_4_ = auVar138._0_4_;
    local_720._24_4_ = auVar138._0_4_;
    local_720._28_4_ = auVar138._0_4_;
    auVar71 = vfmadd231ps_fma(auVar213,local_720,auVar219._0_32_);
    auVar249 = auVar250._0_32_;
    auVar82 = vsubps_avx512vl(auVar249,ZEXT1632(auVar71));
    fVar226 = auVar82._0_4_;
    fVar230 = auVar82._4_4_;
    fVar206 = auVar82._8_4_;
    fVar208 = auVar82._12_4_;
    fVar216 = auVar82._16_4_;
    fVar175 = auVar82._20_4_;
    fVar10 = auVar82._24_4_;
    fVar137 = fVar226 * fVar226 * fVar226;
    fVar152 = fVar230 * fVar230 * fVar230;
    auVar112._4_4_ = fVar152;
    auVar112._0_4_ = fVar137;
    fVar153 = fVar206 * fVar206 * fVar206;
    auVar112._8_4_ = fVar153;
    fVar154 = fVar208 * fVar208 * fVar208;
    auVar112._12_4_ = fVar154;
    fVar155 = fVar216 * fVar216 * fVar216;
    auVar112._16_4_ = fVar155;
    fVar156 = fVar175 * fVar175 * fVar175;
    auVar112._20_4_ = fVar156;
    fVar157 = fVar10 * fVar10 * fVar10;
    auVar112._24_4_ = fVar157;
    auVar112._28_4_ = auVar138._0_4_;
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar93 = vmulps_avx512vl(auVar112,auVar81);
    fVar229 = auVar71._0_4_;
    fVar231 = auVar71._4_4_;
    fVar207 = auVar71._8_4_;
    fVar198 = auVar71._12_4_;
    fVar174 = fVar229 * fVar229 * fVar229;
    fVar195 = fVar231 * fVar231 * fVar231;
    fVar196 = fVar207 * fVar207 * fVar207;
    fVar197 = fVar198 * fVar198 * fVar198;
    auVar233._0_4_ = fVar229 * fVar226;
    auVar233._4_4_ = fVar231 * fVar230;
    auVar233._8_4_ = fVar207 * fVar206;
    auVar233._12_4_ = fVar198 * fVar208;
    auVar233._16_4_ = fVar216 * 0.0;
    auVar233._20_4_ = fVar175 * 0.0;
    auVar233._28_36_ = auVar232._28_36_;
    auVar233._24_4_ = fVar10 * 0.0;
    auVar83 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar197,CONCAT48(fVar196,CONCAT44(fVar195,fVar174))
                                                )),auVar81);
    fVar235 = auVar83._28_4_ + auVar138._0_4_;
    fVar30 = auVar236._28_4_;
    fVar220 = fVar235 + fVar30 + auVar219._28_4_;
    auVar113._4_4_ = fVar152 * 0.16666667;
    auVar113._0_4_ = fVar137 * 0.16666667;
    auVar113._8_4_ = fVar153 * 0.16666667;
    auVar113._12_4_ = fVar154 * 0.16666667;
    auVar113._16_4_ = fVar155 * 0.16666667;
    auVar113._20_4_ = fVar156 * 0.16666667;
    auVar113._24_4_ = fVar157 * 0.16666667;
    auVar113._28_4_ = fVar235;
    auVar114._4_4_ =
         (auVar233._4_4_ * fVar230 * 12.0 + auVar233._4_4_ * fVar231 * 6.0 + fVar195 + auVar93._4_4_
         ) * 0.16666667;
    auVar114._0_4_ =
         (auVar233._0_4_ * fVar226 * 12.0 + auVar233._0_4_ * fVar229 * 6.0 + fVar174 + auVar93._0_4_
         ) * 0.16666667;
    auVar114._8_4_ =
         (auVar233._8_4_ * fVar206 * 12.0 + auVar233._8_4_ * fVar207 * 6.0 + fVar196 + auVar93._8_4_
         ) * 0.16666667;
    auVar114._12_4_ =
         (auVar233._12_4_ * fVar208 * 12.0 + auVar233._12_4_ * fVar198 * 6.0 +
         fVar197 + auVar93._12_4_) * 0.16666667;
    auVar114._16_4_ =
         (auVar233._16_4_ * fVar216 * 12.0 + auVar233._16_4_ * 0.0 * 6.0 + auVar93._16_4_ + 0.0) *
         0.16666667;
    auVar114._20_4_ =
         (auVar233._20_4_ * fVar175 * 12.0 + auVar233._20_4_ * 0.0 * 6.0 + auVar93._20_4_ + 0.0) *
         0.16666667;
    auVar114._24_4_ =
         (auVar233._24_4_ * fVar10 * 12.0 + auVar233._24_4_ * 0.0 * 6.0 + auVar93._24_4_ + 0.0) *
         0.16666667;
    auVar114._28_4_ = fVar30;
    auVar115._4_4_ =
         (auVar83._4_4_ + fVar152 + auVar233._4_4_ * fVar231 * 12.0 + auVar233._4_4_ * fVar230 * 6.0
         ) * 0.16666667;
    auVar115._0_4_ =
         (auVar83._0_4_ + fVar137 + auVar233._0_4_ * fVar229 * 12.0 + auVar233._0_4_ * fVar226 * 6.0
         ) * 0.16666667;
    auVar115._8_4_ =
         (auVar83._8_4_ + fVar153 + auVar233._8_4_ * fVar207 * 12.0 + auVar233._8_4_ * fVar206 * 6.0
         ) * 0.16666667;
    auVar115._12_4_ =
         (auVar83._12_4_ + fVar154 +
         auVar233._12_4_ * fVar198 * 12.0 + auVar233._12_4_ * fVar208 * 6.0) * 0.16666667;
    auVar115._16_4_ =
         (auVar83._16_4_ + fVar155 + auVar233._16_4_ * 0.0 * 12.0 + auVar233._16_4_ * fVar216 * 6.0)
         * 0.16666667;
    auVar115._20_4_ =
         (auVar83._20_4_ + fVar156 + auVar233._20_4_ * 0.0 * 12.0 + auVar233._20_4_ * fVar175 * 6.0)
         * 0.16666667;
    auVar115._24_4_ =
         (auVar83._24_4_ + fVar157 + auVar233._24_4_ * 0.0 * 12.0 + auVar233._24_4_ * fVar10 * 6.0)
         * 0.16666667;
    auVar115._28_4_ = auVar242._28_4_;
    fVar174 = fVar174 * 0.16666667;
    fVar195 = fVar195 * 0.16666667;
    fVar196 = fVar196 * 0.16666667;
    fVar197 = fVar197 * 0.16666667;
    auVar118._28_4_ = fVar220;
    auVar118._0_28_ = ZEXT1628(CONCAT412(fVar197,CONCAT48(fVar196,CONCAT44(fVar195,fVar174))));
    auVar93 = vmulps_avx512vl(local_260,auVar118);
    auVar83 = vmulps_avx512vl(local_280,auVar118);
    auVar119._4_4_ = local_2a0._4_4_ * fVar195;
    auVar119._0_4_ = local_2a0._0_4_ * fVar174;
    auVar119._8_4_ = local_2a0._8_4_ * fVar196;
    auVar119._12_4_ = local_2a0._12_4_ * fVar197;
    auVar119._16_4_ = local_2a0._16_4_ * 0.0;
    auVar119._20_4_ = local_2a0._20_4_ * 0.0;
    auVar119._24_4_ = local_2a0._24_4_ * 0.0;
    auVar119._28_4_ = auVar138._0_4_;
    auVar31._4_4_ = local_2c0._4_4_ * fVar195;
    auVar31._0_4_ = local_2c0._0_4_ * fVar174;
    auVar31._8_4_ = local_2c0._8_4_ * fVar196;
    auVar31._12_4_ = local_2c0._12_4_ * fVar197;
    auVar31._16_4_ = local_2c0._16_4_ * 0.0;
    auVar31._20_4_ = local_2c0._20_4_ * 0.0;
    auVar31._24_4_ = local_2c0._24_4_ * 0.0;
    auVar31._28_4_ = fVar220;
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar115,auVar246._0_32_);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar115,auVar247._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar119,auVar115,auVar248._0_32_);
    auVar80 = vfmadd231ps_avx512vl(auVar31,auVar92,auVar115);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar114,auVar89);
    auVar83 = vfmadd231ps_avx512vl(auVar83,auVar114,auVar86);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar114,auVar90);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar91,auVar114);
    auVar95 = vfmadd231ps_avx512vl(auVar93,auVar113,auVar87);
    auVar96 = vfmadd231ps_avx512vl(auVar83,auVar113,auVar84);
    auVar97 = vfmadd231ps_avx512vl(auVar94,auVar113,auVar85);
    auVar83 = vfmadd231ps_avx512vl(auVar80,auVar88,auVar113);
    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar80 = vxorps_avx512vl(auVar82,auVar94);
    auVar93 = vxorps_avx512vl(ZEXT1632(auVar71),auVar94);
    auVar214._0_4_ = auVar93._0_4_ * fVar229;
    auVar214._4_4_ = auVar93._4_4_ * fVar231;
    auVar214._8_4_ = auVar93._8_4_ * fVar207;
    auVar214._12_4_ = auVar93._12_4_ * fVar198;
    auVar214._16_4_ = auVar93._16_4_ * 0.0;
    auVar214._20_4_ = auVar93._20_4_ * 0.0;
    auVar214._24_4_ = auVar93._24_4_ * 0.0;
    auVar214._28_4_ = 0;
    auVar98 = vmulps_avx512vl(auVar233._0_32_,auVar81);
    auVar93 = vsubps_avx(auVar214,auVar98);
    auVar32._4_4_ = auVar80._4_4_ * fVar230 * 0.5;
    auVar32._0_4_ = auVar80._0_4_ * fVar226 * 0.5;
    auVar32._8_4_ = auVar80._8_4_ * fVar206 * 0.5;
    auVar32._12_4_ = auVar80._12_4_ * fVar208 * 0.5;
    auVar32._16_4_ = auVar80._16_4_ * fVar216 * 0.5;
    auVar32._20_4_ = auVar80._20_4_ * fVar175 * 0.5;
    auVar32._24_4_ = auVar80._24_4_ * fVar10 * 0.5;
    auVar32._28_4_ = auVar82._28_4_;
    auVar33._4_4_ = auVar93._4_4_ * 0.5;
    auVar33._0_4_ = auVar93._0_4_ * 0.5;
    auVar33._8_4_ = auVar93._8_4_ * 0.5;
    auVar33._12_4_ = auVar93._12_4_ * 0.5;
    auVar33._16_4_ = auVar93._16_4_ * 0.5;
    auVar33._20_4_ = auVar93._20_4_ * 0.5;
    auVar33._24_4_ = auVar93._24_4_ * 0.5;
    auVar33._28_4_ = auVar93._28_4_;
    auVar34._4_4_ = (auVar98._4_4_ + fVar230 * fVar230) * 0.5;
    auVar34._0_4_ = (auVar98._0_4_ + fVar226 * fVar226) * 0.5;
    auVar34._8_4_ = (auVar98._8_4_ + fVar206 * fVar206) * 0.5;
    auVar34._12_4_ = (auVar98._12_4_ + fVar208 * fVar208) * 0.5;
    auVar34._16_4_ = (auVar98._16_4_ + fVar216 * fVar216) * 0.5;
    auVar34._20_4_ = (auVar98._20_4_ + fVar175 * fVar175) * 0.5;
    auVar34._24_4_ = (auVar98._24_4_ + fVar10 * fVar10) * 0.5;
    auVar34._28_4_ = auVar98._28_4_ + auVar225._28_4_;
    fVar226 = fVar229 * fVar229 * 0.5;
    fVar229 = fVar231 * fVar231 * 0.5;
    fVar230 = fVar207 * fVar207 * 0.5;
    fVar231 = fVar198 * fVar198 * 0.5;
    auVar35._28_4_ = auVar228._28_4_;
    auVar35._0_28_ = ZEXT1628(CONCAT412(fVar231,CONCAT48(fVar230,CONCAT44(fVar229,fVar226))));
    auVar93 = vmulps_avx512vl(local_260,auVar35);
    auVar82 = vmulps_avx512vl(local_280,auVar35);
    auVar36._4_4_ = local_2a0._4_4_ * fVar229;
    auVar36._0_4_ = local_2a0._0_4_ * fVar226;
    auVar36._8_4_ = local_2a0._8_4_ * fVar230;
    auVar36._12_4_ = local_2a0._12_4_ * fVar231;
    auVar36._16_4_ = local_2a0._16_4_ * 0.0;
    auVar36._20_4_ = local_2a0._20_4_ * 0.0;
    auVar36._24_4_ = local_2a0._24_4_ * 0.0;
    auVar36._28_4_ = fVar30;
    auVar37._4_4_ = fVar229 * local_2c0._4_4_;
    auVar37._0_4_ = fVar226 * local_2c0._0_4_;
    auVar37._8_4_ = fVar230 * local_2c0._8_4_;
    auVar37._12_4_ = fVar231 * local_2c0._12_4_;
    auVar37._16_4_ = local_2c0._16_4_ * 0.0;
    auVar37._20_4_ = local_2c0._20_4_ * 0.0;
    auVar37._24_4_ = local_2c0._24_4_ * 0.0;
    auVar37._28_4_ = auVar228._28_4_;
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar34,auVar246._0_32_);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar34,auVar247._0_32_);
    auVar80 = vfmadd231ps_avx512vl(auVar36,auVar34,auVar248._0_32_);
    auVar71 = vfmadd231ps_fma(auVar37,auVar92,auVar34);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar33,auVar89);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar33,auVar86);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar33,auVar90);
    auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar91,auVar33);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar32,auVar87);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar32,auVar84);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar32,auVar85);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,auVar32);
    auVar38._4_4_ = auVar93._4_4_ * fVar11;
    auVar38._0_4_ = auVar93._0_4_ * fVar11;
    auVar38._8_4_ = auVar93._8_4_ * fVar11;
    auVar38._12_4_ = auVar93._12_4_ * fVar11;
    auVar38._16_4_ = auVar93._16_4_ * fVar11;
    auVar38._20_4_ = auVar93._20_4_ * fVar11;
    auVar38._24_4_ = auVar93._24_4_ * fVar11;
    auVar38._28_4_ = auVar92._28_4_;
    auVar242 = ZEXT3264(auVar38);
    auVar39._4_4_ = auVar82._4_4_ * fVar11;
    auVar39._0_4_ = auVar82._0_4_ * fVar11;
    auVar39._8_4_ = auVar82._8_4_ * fVar11;
    auVar39._12_4_ = auVar82._12_4_ * fVar11;
    auVar39._16_4_ = auVar82._16_4_ * fVar11;
    auVar39._20_4_ = auVar82._20_4_ * fVar11;
    auVar39._24_4_ = auVar82._24_4_ * fVar11;
    auVar39._28_4_ = 0x3e2aaaab;
    auVar40._4_4_ = auVar80._4_4_ * fVar11;
    auVar40._0_4_ = auVar80._0_4_ * fVar11;
    auVar40._8_4_ = auVar80._8_4_ * fVar11;
    auVar40._12_4_ = auVar80._12_4_ * fVar11;
    auVar40._16_4_ = auVar80._16_4_ * fVar11;
    auVar40._20_4_ = auVar80._20_4_ * fVar11;
    auVar40._24_4_ = auVar80._24_4_ * fVar11;
    auVar40._28_4_ = 0x40c00000;
    fVar226 = auVar98._0_4_ * fVar11;
    fVar229 = auVar98._4_4_ * fVar11;
    auVar41._4_4_ = fVar229;
    auVar41._0_4_ = fVar226;
    fVar230 = auVar98._8_4_ * fVar11;
    auVar41._8_4_ = fVar230;
    fVar231 = auVar98._12_4_ * fVar11;
    auVar41._12_4_ = fVar231;
    fVar206 = auVar98._16_4_ * fVar11;
    auVar41._16_4_ = fVar206;
    fVar207 = auVar98._20_4_ * fVar11;
    auVar41._20_4_ = fVar207;
    fVar208 = auVar98._24_4_ * fVar11;
    auVar41._24_4_ = fVar208;
    auVar41._28_4_ = fVar11;
    auVar71 = vxorps_avx512vl(auVar94._0_16_,auVar94._0_16_);
    auVar98 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar232 = ZEXT3264(auVar98);
    auVar99 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar94 = ZEXT1632(auVar71);
    auVar100 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar94);
    auVar236 = ZEXT3264(auVar100);
    auVar215._0_4_ = fVar226 + auVar83._0_4_;
    auVar215._4_4_ = fVar229 + auVar83._4_4_;
    auVar215._8_4_ = fVar230 + auVar83._8_4_;
    auVar215._12_4_ = fVar231 + auVar83._12_4_;
    auVar215._16_4_ = fVar206 + auVar83._16_4_;
    auVar215._20_4_ = fVar207 + auVar83._20_4_;
    auVar215._24_4_ = fVar208 + auVar83._24_4_;
    auVar215._28_4_ = fVar11 + auVar83._28_4_;
    auVar93 = vmaxps_avx(auVar83,auVar215);
    auVar82 = vminps_avx(auVar83,auVar215);
    auVar101 = vpermt2ps_avx512vl(auVar83,_DAT_01fb9fc0,auVar94);
    auVar102 = vpermt2ps_avx512vl(auVar38,_DAT_01fb9fc0,auVar94);
    auVar103 = vpermt2ps_avx512vl(auVar39,_DAT_01fb9fc0,auVar94);
    auVar115 = ZEXT1632(auVar71);
    auVar104 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9fc0,auVar115);
    auVar83 = vpermt2ps_avx512vl(auVar41,_DAT_01fb9fc0,auVar115);
    auVar105 = vsubps_avx512vl(auVar101,auVar83);
    auVar83 = vsubps_avx(auVar98,auVar95);
    auVar228 = ZEXT3264(auVar83);
    auVar94 = vsubps_avx(auVar99,auVar96);
    auVar225 = ZEXT3264(auVar94);
    auVar80 = vsubps_avx(auVar100,auVar97);
    auVar106 = vmulps_avx512vl(auVar94,auVar40);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar39,auVar80);
    auVar107 = vmulps_avx512vl(auVar80,auVar38);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar40,auVar83);
    auVar108 = vmulps_avx512vl(auVar83,auVar39);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar38,auVar94);
    auVar108 = vmulps_avx512vl(auVar108,auVar108);
    auVar107 = vfmadd231ps_avx512vl(auVar108,auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar107 = vmulps_avx512vl(auVar80,auVar80);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar94,auVar94);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar83,auVar83);
    auVar108 = vrcp14ps_avx512vl(auVar107);
    auVar109 = vfnmadd213ps_avx512vl(auVar108,auVar107,auVar249);
    auVar108 = vfmadd132ps_avx512vl(auVar109,auVar108,auVar108);
    auVar106 = vmulps_avx512vl(auVar106,auVar108);
    auVar109 = vmulps_avx512vl(auVar94,auVar104);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar103,auVar80);
    auVar110 = vmulps_avx512vl(auVar80,auVar102);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar104,auVar83);
    auVar111 = vmulps_avx512vl(auVar83,auVar103);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar102,auVar94);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vmulps_avx512vl(auVar109,auVar108);
    auVar106 = vmaxps_avx512vl(auVar106,auVar108);
    auVar106 = vsqrtps_avx512vl(auVar106);
    auVar108 = vmaxps_avx512vl(auVar105,auVar101);
    auVar93 = vmaxps_avx512vl(auVar93,auVar108);
    auVar111 = vaddps_avx512vl(auVar106,auVar93);
    auVar93 = vminps_avx512vl(auVar105,auVar101);
    auVar93 = vminps_avx(auVar82,auVar93);
    auVar93 = vsubps_avx512vl(auVar93,auVar106);
    auVar108._8_4_ = 0x3f800002;
    auVar108._0_8_ = 0x3f8000023f800002;
    auVar108._12_4_ = 0x3f800002;
    auVar108._16_4_ = 0x3f800002;
    auVar108._20_4_ = 0x3f800002;
    auVar108._24_4_ = 0x3f800002;
    auVar108._28_4_ = 0x3f800002;
    auVar82 = vmulps_avx512vl(auVar111,auVar108);
    auVar109._8_4_ = 0x3f7ffffc;
    auVar109._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar109._12_4_ = 0x3f7ffffc;
    auVar109._16_4_ = 0x3f7ffffc;
    auVar109._20_4_ = 0x3f7ffffc;
    auVar109._24_4_ = 0x3f7ffffc;
    auVar109._28_4_ = 0x3f7ffffc;
    auVar93 = vmulps_avx512vl(auVar93,auVar109);
    auVar82 = vmulps_avx512vl(auVar82,auVar82);
    auVar101 = vrsqrt14ps_avx512vl(auVar107);
    auVar110._8_4_ = 0xbf000000;
    auVar110._0_8_ = 0xbf000000bf000000;
    auVar110._12_4_ = 0xbf000000;
    auVar110._16_4_ = 0xbf000000;
    auVar110._20_4_ = 0xbf000000;
    auVar110._24_4_ = 0xbf000000;
    auVar110._28_4_ = 0xbf000000;
    auVar105 = vmulps_avx512vl(auVar107,auVar110);
    fVar226 = auVar101._0_4_;
    fVar229 = auVar101._4_4_;
    fVar230 = auVar101._8_4_;
    fVar231 = auVar101._12_4_;
    fVar206 = auVar101._16_4_;
    fVar207 = auVar101._20_4_;
    fVar208 = auVar101._24_4_;
    auVar42._4_4_ = fVar229 * fVar229 * fVar229 * auVar105._4_4_;
    auVar42._0_4_ = fVar226 * fVar226 * fVar226 * auVar105._0_4_;
    auVar42._8_4_ = fVar230 * fVar230 * fVar230 * auVar105._8_4_;
    auVar42._12_4_ = fVar231 * fVar231 * fVar231 * auVar105._12_4_;
    auVar42._16_4_ = fVar206 * fVar206 * fVar206 * auVar105._16_4_;
    auVar42._20_4_ = fVar207 * fVar207 * fVar207 * auVar105._20_4_;
    auVar42._24_4_ = fVar208 * fVar208 * fVar208 * auVar105._24_4_;
    auVar42._28_4_ = auVar111._28_4_;
    auVar111._8_4_ = 0x3fc00000;
    auVar111._0_8_ = 0x3fc000003fc00000;
    auVar111._12_4_ = 0x3fc00000;
    auVar111._16_4_ = 0x3fc00000;
    auVar111._20_4_ = 0x3fc00000;
    auVar111._24_4_ = 0x3fc00000;
    auVar111._28_4_ = 0x3fc00000;
    auVar101 = vfmadd231ps_avx512vl(auVar42,auVar101,auVar111);
    auVar105 = vmulps_avx512vl(auVar83,auVar101);
    auVar106 = vmulps_avx512vl(auVar94,auVar101);
    auVar107 = vmulps_avx512vl(auVar80,auVar101);
    auVar108 = vsubps_avx512vl(auVar115,auVar95);
    auVar109 = vsubps_avx512vl(auVar115,auVar96);
    auVar110 = vsubps_avx512vl(auVar115,auVar97);
    auVar111 = vmulps_avx512vl(local_480,auVar110);
    auVar111 = vfmadd231ps_avx512vl(auVar111,local_460,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,local_440,auVar108);
    auVar112 = vmulps_avx512vl(auVar110,auVar110);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,auVar109);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar108);
    auVar113 = vmulps_avx512vl(local_480,auVar107);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar106,local_460);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar105,local_440);
    auVar107 = vmulps_avx512vl(auVar110,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar105);
    auVar106 = vmulps_avx512vl(auVar113,auVar113);
    auVar107 = vsubps_avx512vl(local_220,auVar106);
    auVar114 = vmulps_avx512vl(auVar113,auVar105);
    auVar111 = vsubps_avx512vl(auVar111,auVar114);
    auVar111 = vaddps_avx512vl(auVar111,auVar111);
    auVar114 = vmulps_avx512vl(auVar105,auVar105);
    local_740 = vsubps_avx512vl(auVar112,auVar114);
    auVar82 = vsubps_avx512vl(local_740,auVar82);
    local_7c0 = vmulps_avx512vl(auVar111,auVar111);
    _local_7e0 = vmulps_avx512vl(auVar107,auVar81);
    auVar81 = vmulps_avx512vl(_local_7e0,auVar82);
    auVar81 = vsubps_avx512vl(local_7c0,auVar81);
    uVar65 = vcmpps_avx512vl(auVar81,auVar115,5);
    bVar59 = (byte)uVar65;
    if (bVar59 == 0) {
LAB_01a9c5b2:
      auVar219 = ZEXT3264(_DAT_01f7b040);
      auVar246 = ZEXT3264(local_820);
      auVar247 = ZEXT3264(local_840);
      auVar248 = ZEXT3264(local_860);
    }
    else {
      auVar81 = vsqrtps_avx512vl(auVar81);
      auVar112 = vaddps_avx512vl(auVar107,auVar107);
      local_800 = vrcp14ps_avx512vl(auVar112);
      auVar114 = vfnmadd213ps_avx512vl(local_800,auVar112,auVar249);
      auVar114 = vfmadd132ps_avx512vl(auVar114,local_800,local_800);
      auVar249._8_4_ = 0x80000000;
      auVar249._0_8_ = 0x8000000080000000;
      auVar249._12_4_ = 0x80000000;
      auVar249._16_4_ = 0x80000000;
      auVar249._20_4_ = 0x80000000;
      auVar249._24_4_ = 0x80000000;
      auVar249._28_4_ = 0x80000000;
      _local_5a0 = vxorps_avx512vl(auVar111,auVar249);
      auVar115 = vsubps_avx512vl(_local_5a0,auVar81);
      local_580 = vmulps_avx512vl(auVar115,auVar114);
      auVar81 = vsubps_avx512vl(auVar81,auVar111);
      local_5c0 = vmulps_avx512vl(auVar81,auVar114);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar114 = vblendmps_avx512vl(auVar81,local_580);
      auVar116._0_4_ =
           (uint)(bVar59 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar81._0_4_;
      bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar67 * auVar114._4_4_ | (uint)!bVar67 * auVar81._4_4_;
      bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar67 * auVar114._8_4_ | (uint)!bVar67 * auVar81._8_4_;
      bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar67 * auVar114._12_4_ | (uint)!bVar67 * auVar81._12_4_;
      bVar67 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar67 * auVar114._16_4_ | (uint)!bVar67 * auVar81._16_4_;
      bVar67 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar67 * auVar114._20_4_ | (uint)!bVar67 * auVar81._20_4_;
      bVar67 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar67 * auVar114._24_4_ | (uint)!bVar67 * auVar81._24_4_;
      bVar67 = SUB81(uVar65 >> 7,0);
      auVar116._28_4_ = (uint)bVar67 * auVar114._28_4_ | (uint)!bVar67 * auVar81._28_4_;
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar114 = vblendmps_avx512vl(auVar81,local_5c0);
      auVar117._0_4_ =
           (uint)(bVar59 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar81._0_4_;
      bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar67 * auVar114._4_4_ | (uint)!bVar67 * auVar81._4_4_;
      bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar67 * auVar114._8_4_ | (uint)!bVar67 * auVar81._8_4_;
      bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar67 * auVar114._12_4_ | (uint)!bVar67 * auVar81._12_4_;
      bVar67 = (bool)((byte)(uVar65 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar67 * auVar114._16_4_ | (uint)!bVar67 * auVar81._16_4_;
      bVar67 = (bool)((byte)(uVar65 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar67 * auVar114._20_4_ | (uint)!bVar67 * auVar81._20_4_;
      bVar67 = (bool)((byte)(uVar65 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar67 * auVar114._24_4_ | (uint)!bVar67 * auVar81._24_4_;
      bVar67 = SUB81(uVar65 >> 7,0);
      auVar117._28_4_ = (uint)bVar67 * auVar114._28_4_ | (uint)!bVar67 * auVar81._28_4_;
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar106,auVar81);
      local_5e0 = vmaxps_avx512vl(local_240,auVar81);
      auVar23._8_4_ = 0x36000000;
      auVar23._0_8_ = 0x3600000036000000;
      auVar23._12_4_ = 0x36000000;
      auVar23._16_4_ = 0x36000000;
      auVar23._20_4_ = 0x36000000;
      auVar23._24_4_ = 0x36000000;
      auVar23._28_4_ = 0x36000000;
      local_600 = vmulps_avx512vl(local_5e0,auVar23);
      vandps_avx512vl(auVar107,auVar81);
      uVar66 = vcmpps_avx512vl(local_600,local_600,1);
      uVar65 = uVar65 & uVar66;
      bVar64 = (byte)uVar65;
      if (bVar64 != 0) {
        uVar66 = vcmpps_avx512vl(auVar82,_DAT_01f7b000,2);
        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar106 = vblendmps_avx512vl(auVar82,auVar81);
        bVar62 = (byte)uVar66;
        uVar68 = (uint)(bVar62 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar62 & 1) * local_600._0_4_;
        bVar67 = (bool)((byte)(uVar66 >> 1) & 1);
        uVar129 = (uint)bVar67 * auVar106._4_4_ | (uint)!bVar67 * local_600._4_4_;
        bVar67 = (bool)((byte)(uVar66 >> 2) & 1);
        uVar130 = (uint)bVar67 * auVar106._8_4_ | (uint)!bVar67 * local_600._8_4_;
        bVar67 = (bool)((byte)(uVar66 >> 3) & 1);
        uVar131 = (uint)bVar67 * auVar106._12_4_ | (uint)!bVar67 * local_600._12_4_;
        bVar67 = (bool)((byte)(uVar66 >> 4) & 1);
        uVar132 = (uint)bVar67 * auVar106._16_4_ | (uint)!bVar67 * local_600._16_4_;
        bVar67 = (bool)((byte)(uVar66 >> 5) & 1);
        uVar133 = (uint)bVar67 * auVar106._20_4_ | (uint)!bVar67 * local_600._20_4_;
        bVar67 = (bool)((byte)(uVar66 >> 6) & 1);
        uVar134 = (uint)bVar67 * auVar106._24_4_ | (uint)!bVar67 * local_600._24_4_;
        bVar67 = SUB81(uVar66 >> 7,0);
        uVar135 = (uint)bVar67 * auVar106._28_4_ | (uint)!bVar67 * local_600._28_4_;
        auVar116._0_4_ = (bVar64 & 1) * uVar68 | !(bool)(bVar64 & 1) * auVar116._0_4_;
        bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar116._4_4_ = bVar67 * uVar129 | !bVar67 * auVar116._4_4_;
        bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar116._8_4_ = bVar67 * uVar130 | !bVar67 * auVar116._8_4_;
        bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar116._12_4_ = bVar67 * uVar131 | !bVar67 * auVar116._12_4_;
        bVar67 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar116._16_4_ = bVar67 * uVar132 | !bVar67 * auVar116._16_4_;
        bVar67 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar116._20_4_ = bVar67 * uVar133 | !bVar67 * auVar116._20_4_;
        bVar67 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar116._24_4_ = bVar67 * uVar134 | !bVar67 * auVar116._24_4_;
        bVar67 = SUB81(uVar65 >> 7,0);
        auVar116._28_4_ = bVar67 * uVar135 | !bVar67 * auVar116._28_4_;
        auVar82 = vblendmps_avx512vl(auVar81,auVar82);
        bVar67 = (bool)((byte)(uVar66 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar66 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar66 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar66 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar66 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar66 >> 6) & 1);
        bVar9 = SUB81(uVar66 >> 7,0);
        auVar117._0_4_ =
             (uint)(bVar64 & 1) *
             ((uint)(bVar62 & 1) * auVar82._0_4_ | !(bool)(bVar62 & 1) * uVar68) |
             !(bool)(bVar64 & 1) * auVar117._0_4_;
        bVar3 = (bool)((byte)(uVar65 >> 1) & 1);
        auVar117._4_4_ =
             (uint)bVar3 * ((uint)bVar67 * auVar82._4_4_ | !bVar67 * uVar129) |
             !bVar3 * auVar117._4_4_;
        bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
        auVar117._8_4_ =
             (uint)bVar67 * ((uint)bVar4 * auVar82._8_4_ | !bVar4 * uVar130) |
             !bVar67 * auVar117._8_4_;
        bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
        auVar117._12_4_ =
             (uint)bVar67 * ((uint)bVar5 * auVar82._12_4_ | !bVar5 * uVar131) |
             !bVar67 * auVar117._12_4_;
        bVar67 = (bool)((byte)(uVar65 >> 4) & 1);
        auVar117._16_4_ =
             (uint)bVar67 * ((uint)bVar6 * auVar82._16_4_ | !bVar6 * uVar132) |
             !bVar67 * auVar117._16_4_;
        bVar67 = (bool)((byte)(uVar65 >> 5) & 1);
        auVar117._20_4_ =
             (uint)bVar67 * ((uint)bVar7 * auVar82._20_4_ | !bVar7 * uVar133) |
             !bVar67 * auVar117._20_4_;
        bVar67 = (bool)((byte)(uVar65 >> 6) & 1);
        auVar117._24_4_ =
             (uint)bVar67 * ((uint)bVar8 * auVar82._24_4_ | !bVar8 * uVar134) |
             !bVar67 * auVar117._24_4_;
        bVar67 = SUB81(uVar65 >> 7,0);
        auVar117._28_4_ =
             (uint)bVar67 * ((uint)bVar9 * auVar82._28_4_ | !bVar9 * uVar135) |
             !bVar67 * auVar117._28_4_;
        bVar59 = (~bVar64 | bVar62) & bVar59;
      }
      if ((bVar59 & 0x7f) == 0) {
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar250 = ZEXT3264(auVar93);
        auVar219 = ZEXT3264(_DAT_01f7b040);
        auVar246 = ZEXT3264(local_820);
        auVar247 = ZEXT3264(local_840);
        auVar248 = ZEXT3264(local_860);
      }
      else {
        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar81 = vxorps_avx512vl(auVar104,auVar82);
        auVar102 = vxorps_avx512vl(auVar102,auVar82);
        auVar219 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
        auVar103 = vxorps_avx512vl(auVar103,auVar82);
        auVar71 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                                 ZEXT416((uint)local_660._0_4_));
        auVar104 = vbroadcastss_avx512vl(auVar71);
        auVar104 = vminps_avx512vl(auVar104,auVar117);
        auVar58._4_4_ = fStack_2dc;
        auVar58._0_4_ = local_2e0;
        auVar58._8_4_ = fStack_2d8;
        auVar58._12_4_ = fStack_2d4;
        auVar58._16_4_ = fStack_2d0;
        auVar58._20_4_ = fStack_2cc;
        auVar58._24_4_ = fStack_2c8;
        auVar58._28_4_ = fStack_2c4;
        auVar106 = vmaxps_avx512vl(auVar58,auVar116);
        auVar107 = vmulps_avx512vl(auVar40,auVar110);
        auVar107 = vfmadd213ps_avx512vl(auVar109,auVar39,auVar107);
        auVar71 = vfmadd213ps_fma(auVar108,auVar38,auVar107);
        auVar107 = vmulps_avx512vl(local_480,auVar40);
        auVar107 = vfmadd231ps_avx512vl(auVar107,local_460,auVar39);
        auVar107 = vfmadd231ps_avx512vl(auVar107,local_440,auVar38);
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar107,auVar108);
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar12 = vcmpps_avx512vl(auVar108,auVar109,1);
        auVar110 = vxorps_avx512vl(ZEXT1632(auVar71),auVar82);
        auVar114 = vrcp14ps_avx512vl(auVar107);
        auVar115 = vxorps_avx512vl(auVar107,auVar82);
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar119 = vfnmadd213ps_avx512vl(auVar114,auVar107,auVar118);
        auVar71 = vfmadd132ps_fma(auVar119,auVar114,auVar114);
        fVar226 = auVar71._0_4_ * auVar110._0_4_;
        fVar229 = auVar71._4_4_ * auVar110._4_4_;
        auVar43._4_4_ = fVar229;
        auVar43._0_4_ = fVar226;
        fVar230 = auVar71._8_4_ * auVar110._8_4_;
        auVar43._8_4_ = fVar230;
        fVar231 = auVar71._12_4_ * auVar110._12_4_;
        auVar43._12_4_ = fVar231;
        fVar206 = auVar110._16_4_ * 0.0;
        auVar43._16_4_ = fVar206;
        fVar207 = auVar110._20_4_ * 0.0;
        auVar43._20_4_ = fVar207;
        fVar208 = auVar110._24_4_ * 0.0;
        auVar43._24_4_ = fVar208;
        auVar43._28_4_ = auVar110._28_4_;
        uVar14 = vcmpps_avx512vl(auVar107,auVar115,1);
        bVar64 = (byte)uVar12 | (byte)uVar14;
        auVar240._8_4_ = 0xff800000;
        auVar240._0_8_ = 0xff800000ff800000;
        auVar240._12_4_ = 0xff800000;
        auVar240._16_4_ = 0xff800000;
        auVar240._20_4_ = 0xff800000;
        auVar240._24_4_ = 0xff800000;
        auVar240._28_4_ = 0xff800000;
        auVar114 = vblendmps_avx512vl(auVar43,auVar240);
        auVar120._0_4_ = (uint)(bVar64 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar64 & 1) * -0x800000
        ;
        bVar67 = (bool)(bVar64 >> 1 & 1);
        auVar120._4_4_ = (uint)bVar67 * auVar114._4_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)(bVar64 >> 2 & 1);
        auVar120._8_4_ = (uint)bVar67 * auVar114._8_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)(bVar64 >> 3 & 1);
        auVar120._12_4_ = (uint)bVar67 * auVar114._12_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)(bVar64 >> 4 & 1);
        auVar120._16_4_ = (uint)bVar67 * auVar114._16_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)(bVar64 >> 5 & 1);
        auVar120._20_4_ = (uint)bVar67 * auVar114._20_4_ | (uint)!bVar67 * -0x800000;
        bVar67 = (bool)(bVar64 >> 6 & 1);
        auVar120._24_4_ = (uint)bVar67 * auVar114._24_4_ | (uint)!bVar67 * -0x800000;
        auVar120._28_4_ =
             (uint)(bVar64 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar64 >> 7) * -0x800000;
        auVar114 = vmaxps_avx512vl(auVar106,auVar120);
        auVar242 = ZEXT3264(auVar114);
        uVar14 = vcmpps_avx512vl(auVar107,auVar115,6);
        bVar64 = (byte)uVar12 | (byte)uVar14;
        auVar121._0_4_ = (uint)(bVar64 & 1) * 0x7f800000 | (uint)!(bool)(bVar64 & 1) * (int)fVar226;
        bVar67 = (bool)(bVar64 >> 1 & 1);
        auVar121._4_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar229;
        bVar67 = (bool)(bVar64 >> 2 & 1);
        auVar121._8_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar230;
        bVar67 = (bool)(bVar64 >> 3 & 1);
        auVar121._12_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar231;
        bVar67 = (bool)(bVar64 >> 4 & 1);
        auVar121._16_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar206;
        bVar67 = (bool)(bVar64 >> 5 & 1);
        auVar121._20_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar207;
        bVar67 = (bool)(bVar64 >> 6 & 1);
        auVar121._24_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar208;
        auVar121._28_4_ =
             (uint)(bVar64 >> 7) * 0x7f800000 | (uint)!(bool)(bVar64 >> 7) * auVar110._28_4_;
        auVar104 = vminps_avx512vl(auVar104,auVar121);
        auVar71 = vxorps_avx512vl(auVar106._0_16_,auVar106._0_16_);
        auVar98 = vsubps_avx512vl(ZEXT1632(auVar71),auVar98);
        auVar99 = vsubps_avx512vl(ZEXT1632(auVar71),auVar99);
        auVar106 = ZEXT1632(auVar71);
        auVar100 = vsubps_avx512vl(auVar106,auVar100);
        auVar100 = vmulps_avx512vl(auVar100,auVar81);
        auVar99 = vfmadd231ps_avx512vl(auVar100,auVar103,auVar99);
        auVar98 = vfmadd231ps_avx512vl(auVar99,auVar102,auVar98);
        auVar81 = vmulps_avx512vl(local_480,auVar81);
        auVar81 = vfmadd231ps_avx512vl(auVar81,local_460,auVar103);
        auVar250 = ZEXT3264(auVar118);
        auVar81 = vfmadd231ps_avx512vl(auVar81,local_440,auVar102);
        vandps_avx512vl(auVar81,auVar108);
        uVar12 = vcmpps_avx512vl(auVar81,auVar109,1);
        auVar98 = vxorps_avx512vl(auVar98,auVar82);
        auVar99 = vrcp14ps_avx512vl(auVar81);
        auVar82 = vxorps_avx512vl(auVar81,auVar82);
        auVar236 = ZEXT3264(auVar82);
        auVar100 = vfnmadd213ps_avx512vl(auVar99,auVar81,auVar118);
        auVar71 = vfmadd132ps_fma(auVar100,auVar99,auVar99);
        fVar226 = auVar71._0_4_ * auVar98._0_4_;
        fVar229 = auVar71._4_4_ * auVar98._4_4_;
        auVar44._4_4_ = fVar229;
        auVar44._0_4_ = fVar226;
        fVar230 = auVar71._8_4_ * auVar98._8_4_;
        auVar44._8_4_ = fVar230;
        fVar231 = auVar71._12_4_ * auVar98._12_4_;
        auVar44._12_4_ = fVar231;
        fVar206 = auVar98._16_4_ * 0.0;
        auVar44._16_4_ = fVar206;
        fVar207 = auVar98._20_4_ * 0.0;
        auVar44._20_4_ = fVar207;
        fVar208 = auVar98._24_4_ * 0.0;
        auVar44._24_4_ = fVar208;
        auVar44._28_4_ = auVar98._28_4_;
        uVar14 = vcmpps_avx512vl(auVar81,auVar82,1);
        bVar64 = (byte)uVar12 | (byte)uVar14;
        auVar24._8_4_ = 0xff800000;
        auVar24._0_8_ = 0xff800000ff800000;
        auVar24._12_4_ = 0xff800000;
        auVar24._16_4_ = 0xff800000;
        auVar24._20_4_ = 0xff800000;
        auVar24._24_4_ = 0xff800000;
        auVar24._28_4_ = 0xff800000;
        auVar100 = vblendmps_avx512vl(auVar44,auVar24);
        auVar122._0_4_ =
             (uint)(bVar64 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar99._0_4_;
        bVar67 = (bool)(bVar64 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar67 * auVar100._4_4_ | (uint)!bVar67 * auVar99._4_4_;
        bVar67 = (bool)(bVar64 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar67 * auVar100._8_4_ | (uint)!bVar67 * auVar99._8_4_;
        bVar67 = (bool)(bVar64 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar67 * auVar100._12_4_ | (uint)!bVar67 * auVar99._12_4_;
        bVar67 = (bool)(bVar64 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar67 * auVar100._16_4_ | (uint)!bVar67 * auVar99._16_4_;
        bVar67 = (bool)(bVar64 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar67 * auVar100._20_4_ | (uint)!bVar67 * auVar99._20_4_;
        bVar67 = (bool)(bVar64 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar67 * auVar100._24_4_ | (uint)!bVar67 * auVar99._24_4_;
        auVar122._28_4_ =
             (uint)(bVar64 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar99._28_4_;
        local_420 = vmaxps_avx(auVar114,auVar122);
        uVar14 = vcmpps_avx512vl(auVar81,auVar82,6);
        bVar64 = (byte)uVar12 | (byte)uVar14;
        auVar123._0_4_ = (uint)(bVar64 & 1) * 0x7f800000 | (uint)!(bool)(bVar64 & 1) * (int)fVar226;
        bVar67 = (bool)(bVar64 >> 1 & 1);
        auVar123._4_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar229;
        bVar67 = (bool)(bVar64 >> 2 & 1);
        auVar123._8_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar230;
        bVar67 = (bool)(bVar64 >> 3 & 1);
        auVar123._12_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar231;
        bVar67 = (bool)(bVar64 >> 4 & 1);
        auVar123._16_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar206;
        bVar67 = (bool)(bVar64 >> 5 & 1);
        auVar123._20_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar207;
        bVar67 = (bool)(bVar64 >> 6 & 1);
        auVar123._24_4_ = (uint)bVar67 * 0x7f800000 | (uint)!bVar67 * (int)fVar208;
        auVar123._28_4_ =
             (uint)(bVar64 >> 7) * 0x7f800000 | (uint)!(bool)(bVar64 >> 7) * auVar98._28_4_;
        local_340 = vminps_avx(auVar104,auVar123);
        auVar232 = ZEXT3264(local_340);
        uVar12 = vcmpps_avx512vl(local_420,local_340,2);
        bVar59 = bVar59 & 0x7f & (byte)uVar12;
        if (bVar59 == 0) goto LAB_01a9c5b2;
        auVar82 = vmaxps_avx512vl(auVar106,auVar93);
        auVar93 = vfmadd213ps_avx512vl(local_580,auVar113,auVar105);
        fVar226 = auVar101._0_4_;
        fVar229 = auVar101._4_4_;
        auVar45._4_4_ = fVar229 * auVar93._4_4_;
        auVar45._0_4_ = fVar226 * auVar93._0_4_;
        fVar230 = auVar101._8_4_;
        auVar45._8_4_ = fVar230 * auVar93._8_4_;
        fVar231 = auVar101._12_4_;
        auVar45._12_4_ = fVar231 * auVar93._12_4_;
        fVar206 = auVar101._16_4_;
        auVar45._16_4_ = fVar206 * auVar93._16_4_;
        fVar207 = auVar101._20_4_;
        auVar45._20_4_ = fVar207 * auVar93._20_4_;
        fVar208 = auVar101._24_4_;
        auVar45._24_4_ = fVar208 * auVar93._24_4_;
        auVar45._28_4_ = auVar93._28_4_;
        auVar93 = vfmadd213ps_avx512vl(local_5c0,auVar113,auVar105);
        auVar46._4_4_ = fVar229 * auVar93._4_4_;
        auVar46._0_4_ = fVar226 * auVar93._0_4_;
        auVar46._8_4_ = fVar230 * auVar93._8_4_;
        auVar46._12_4_ = fVar231 * auVar93._12_4_;
        auVar46._16_4_ = fVar206 * auVar93._16_4_;
        auVar46._20_4_ = fVar207 * auVar93._20_4_;
        auVar46._24_4_ = fVar208 * auVar93._24_4_;
        auVar46._28_4_ = auVar93._28_4_;
        auVar93 = vminps_avx512vl(auVar45,auVar118);
        auVar53 = ZEXT812(0);
        auVar81 = ZEXT1232(auVar53) << 0x20;
        auVar93 = vmaxps_avx(auVar93,ZEXT1232(auVar53) << 0x20);
        auVar98 = vminps_avx512vl(auVar46,auVar118);
        auVar47._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
        auVar47._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
        auVar47._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
        auVar47._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
        auVar47._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
        auVar47._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
        auVar47._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
        auVar47._28_4_ = auVar93._28_4_ + 7.0;
        local_1e0 = vfmadd213ps_avx512vl(auVar47,local_720,auVar213);
        auVar93 = vmaxps_avx(auVar98,ZEXT1232(auVar53) << 0x20);
        auVar48._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
        auVar48._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
        auVar48._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
        auVar48._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
        auVar48._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
        auVar48._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
        auVar48._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
        auVar48._28_4_ = auVar93._28_4_ + 7.0;
        local_200 = vfmadd213ps_avx512vl(auVar48,local_720,auVar213);
        auVar49._4_4_ = auVar82._4_4_ * auVar82._4_4_;
        auVar49._0_4_ = auVar82._0_4_ * auVar82._0_4_;
        auVar49._8_4_ = auVar82._8_4_ * auVar82._8_4_;
        auVar49._12_4_ = auVar82._12_4_ * auVar82._12_4_;
        auVar49._16_4_ = auVar82._16_4_ * auVar82._16_4_;
        auVar49._20_4_ = auVar82._20_4_ * auVar82._20_4_;
        auVar49._24_4_ = auVar82._24_4_ * auVar82._24_4_;
        auVar49._28_4_ = auVar82._28_4_;
        auVar93 = vsubps_avx(local_740,auVar49);
        auVar50._4_4_ = auVar93._4_4_ * (float)local_7e0._4_4_;
        auVar50._0_4_ = auVar93._0_4_ * (float)local_7e0._0_4_;
        auVar50._8_4_ = auVar93._8_4_ * fStack_7d8;
        auVar50._12_4_ = auVar93._12_4_ * fStack_7d4;
        auVar50._16_4_ = auVar93._16_4_ * fStack_7d0;
        auVar50._20_4_ = auVar93._20_4_ * fStack_7cc;
        auVar50._24_4_ = auVar93._24_4_ * fStack_7c8;
        auVar50._28_4_ = auVar82._28_4_;
        auVar82 = vsubps_avx(local_7c0,auVar50);
        uVar12 = vcmpps_avx512vl(auVar82,ZEXT1232(auVar53) << 0x20,5);
        bVar64 = (byte)uVar12;
        auVar246 = ZEXT3264(local_820);
        auVar247 = ZEXT3264(local_840);
        auVar248 = ZEXT3264(local_860);
        if (bVar64 == 0) {
          bVar64 = 0;
          auVar83 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar225 = ZEXT864(0) << 0x20;
          auVar82 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar98 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar234 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar124._8_4_ = 0x7f800000;
          auVar124._0_8_ = 0x7f8000007f800000;
          auVar124._12_4_ = 0x7f800000;
          auVar124._16_4_ = 0x7f800000;
          auVar124._20_4_ = 0x7f800000;
          auVar124._24_4_ = 0x7f800000;
          auVar124._28_4_ = 0x7f800000;
          auVar125._8_4_ = 0xff800000;
          auVar125._0_8_ = 0xff800000ff800000;
          auVar125._12_4_ = 0xff800000;
          auVar125._16_4_ = 0xff800000;
          auVar125._20_4_ = 0xff800000;
          auVar125._24_4_ = 0xff800000;
          auVar125._28_4_ = 0xff800000;
        }
        else {
          auVar72 = vxorps_avx512vl(auVar138,auVar138);
          uVar65 = vcmpps_avx512vl(auVar82,auVar106,5);
          auVar82 = vsqrtps_avx(auVar82);
          auVar81 = vfnmadd213ps_avx512vl(auVar112,local_800,auVar118);
          auVar99 = vfmadd132ps_avx512vl(auVar81,local_800,local_800);
          auVar81 = vsubps_avx(_local_5a0,auVar82);
          auVar100 = vmulps_avx512vl(auVar81,auVar99);
          auVar82 = vsubps_avx512vl(auVar82,auVar111);
          auVar99 = vmulps_avx512vl(auVar82,auVar99);
          auVar82 = vfmadd213ps_avx512vl(auVar113,auVar100,auVar105);
          auVar51._4_4_ = fVar229 * auVar82._4_4_;
          auVar51._0_4_ = fVar226 * auVar82._0_4_;
          auVar51._8_4_ = fVar230 * auVar82._8_4_;
          auVar51._12_4_ = fVar231 * auVar82._12_4_;
          auVar51._16_4_ = fVar206 * auVar82._16_4_;
          auVar51._20_4_ = fVar207 * auVar82._20_4_;
          auVar51._24_4_ = fVar208 * auVar82._24_4_;
          auVar51._28_4_ = auVar98._28_4_;
          auVar82 = vmulps_avx512vl(local_440,auVar100);
          auVar81 = vmulps_avx512vl(local_460,auVar100);
          auVar102 = vmulps_avx512vl(local_480,auVar100);
          auVar98 = vfmadd213ps_avx512vl(auVar83,auVar51,auVar95);
          auVar82 = vsubps_avx512vl(auVar82,auVar98);
          auVar98 = vfmadd213ps_avx512vl(auVar94,auVar51,auVar96);
          auVar98 = vsubps_avx512vl(auVar81,auVar98);
          auVar71 = vfmadd213ps_fma(auVar51,auVar80,auVar97);
          auVar81 = vsubps_avx(auVar102,ZEXT1632(auVar71));
          auVar234 = auVar81._0_28_;
          auVar81 = vfmadd213ps_avx512vl(auVar113,auVar99,auVar105);
          auVar101 = vmulps_avx512vl(auVar101,auVar81);
          auVar81 = vmulps_avx512vl(local_440,auVar99);
          auVar102 = vmulps_avx512vl(local_460,auVar99);
          auVar103 = vmulps_avx512vl(local_480,auVar99);
          auVar71 = vfmadd213ps_fma(auVar83,auVar101,auVar95);
          auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar94,auVar101,auVar96);
          auVar83 = vsubps_avx512vl(auVar102,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar80,auVar101,auVar97);
          auVar94 = vsubps_avx512vl(auVar103,ZEXT1632(auVar71));
          auVar225 = ZEXT3264(auVar94);
          auVar145._8_4_ = 0x7f800000;
          auVar145._0_8_ = 0x7f8000007f800000;
          auVar145._12_4_ = 0x7f800000;
          auVar145._16_4_ = 0x7f800000;
          auVar145._20_4_ = 0x7f800000;
          auVar145._24_4_ = 0x7f800000;
          auVar145._28_4_ = 0x7f800000;
          auVar94 = vblendmps_avx512vl(auVar145,auVar100);
          bVar67 = (bool)((byte)uVar65 & 1);
          auVar124._0_4_ = (uint)bVar67 * auVar94._0_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar67 * auVar94._4_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar67 * auVar94._8_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar67 * auVar94._12_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar67 * auVar94._16_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar67 * auVar94._20_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar67 * auVar94._24_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = SUB81(uVar65 >> 7,0);
          auVar124._28_4_ = (uint)bVar67 * auVar94._28_4_ | (uint)!bVar67 * 0x7f800000;
          auVar192._8_4_ = 0xff800000;
          auVar192._0_8_ = 0xff800000ff800000;
          auVar192._12_4_ = 0xff800000;
          auVar192._16_4_ = 0xff800000;
          auVar192._20_4_ = 0xff800000;
          auVar192._24_4_ = 0xff800000;
          auVar192._28_4_ = 0xff800000;
          auVar94 = vblendmps_avx512vl(auVar192,auVar99);
          bVar67 = (bool)((byte)uVar65 & 1);
          auVar125._0_4_ = (uint)bVar67 * auVar94._0_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar67 * auVar94._4_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar67 * auVar94._8_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar67 * auVar94._12_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar65 >> 4) & 1);
          auVar125._16_4_ = (uint)bVar67 * auVar94._16_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar65 >> 5) & 1);
          auVar125._20_4_ = (uint)bVar67 * auVar94._20_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar65 >> 6) & 1);
          auVar125._24_4_ = (uint)bVar67 * auVar94._24_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = SUB81(uVar65 >> 7,0);
          auVar125._28_4_ = (uint)bVar67 * auVar94._28_4_ | (uint)!bVar67 * -0x800000;
          auVar25._8_4_ = 0x36000000;
          auVar25._0_8_ = 0x3600000036000000;
          auVar25._12_4_ = 0x36000000;
          auVar25._16_4_ = 0x36000000;
          auVar25._20_4_ = 0x36000000;
          auVar25._24_4_ = 0x36000000;
          auVar25._28_4_ = 0x36000000;
          auVar94 = vmulps_avx512vl(local_5e0,auVar25);
          uVar66 = vcmpps_avx512vl(auVar94,local_600,0xe);
          uVar65 = uVar65 & uVar66;
          bVar62 = (byte)uVar65;
          if (bVar62 != 0) {
            uVar66 = vcmpps_avx512vl(auVar93,ZEXT1632(auVar72),2);
            auVar227._8_4_ = 0x7f800000;
            auVar227._0_8_ = 0x7f8000007f800000;
            auVar227._12_4_ = 0x7f800000;
            auVar227._16_4_ = 0x7f800000;
            auVar227._20_4_ = 0x7f800000;
            auVar227._24_4_ = 0x7f800000;
            auVar227._28_4_ = 0x7f800000;
            auVar241._8_4_ = 0xff800000;
            auVar241._0_8_ = 0xff800000ff800000;
            auVar241._12_4_ = 0xff800000;
            auVar241._16_4_ = 0xff800000;
            auVar241._20_4_ = 0xff800000;
            auVar241._24_4_ = 0xff800000;
            auVar241._28_4_ = 0xff800000;
            auVar93 = vblendmps_avx512vl(auVar227,auVar241);
            bVar60 = (byte)uVar66;
            uVar68 = (uint)(bVar60 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar94._0_4_;
            bVar67 = (bool)((byte)(uVar66 >> 1) & 1);
            uVar129 = (uint)bVar67 * auVar93._4_4_ | (uint)!bVar67 * auVar94._4_4_;
            bVar67 = (bool)((byte)(uVar66 >> 2) & 1);
            uVar130 = (uint)bVar67 * auVar93._8_4_ | (uint)!bVar67 * auVar94._8_4_;
            bVar67 = (bool)((byte)(uVar66 >> 3) & 1);
            uVar131 = (uint)bVar67 * auVar93._12_4_ | (uint)!bVar67 * auVar94._12_4_;
            bVar67 = (bool)((byte)(uVar66 >> 4) & 1);
            uVar132 = (uint)bVar67 * auVar93._16_4_ | (uint)!bVar67 * auVar94._16_4_;
            bVar67 = (bool)((byte)(uVar66 >> 5) & 1);
            uVar133 = (uint)bVar67 * auVar93._20_4_ | (uint)!bVar67 * auVar94._20_4_;
            bVar67 = (bool)((byte)(uVar66 >> 6) & 1);
            uVar134 = (uint)bVar67 * auVar93._24_4_ | (uint)!bVar67 * auVar94._24_4_;
            bVar67 = SUB81(uVar66 >> 7,0);
            uVar135 = (uint)bVar67 * auVar93._28_4_ | (uint)!bVar67 * auVar94._28_4_;
            auVar124._0_4_ = (bVar62 & 1) * uVar68 | !(bool)(bVar62 & 1) * auVar124._0_4_;
            bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
            auVar124._4_4_ = bVar67 * uVar129 | !bVar67 * auVar124._4_4_;
            bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
            auVar124._8_4_ = bVar67 * uVar130 | !bVar67 * auVar124._8_4_;
            bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar124._12_4_ = bVar67 * uVar131 | !bVar67 * auVar124._12_4_;
            bVar67 = (bool)((byte)(uVar65 >> 4) & 1);
            auVar124._16_4_ = bVar67 * uVar132 | !bVar67 * auVar124._16_4_;
            bVar67 = (bool)((byte)(uVar65 >> 5) & 1);
            auVar124._20_4_ = bVar67 * uVar133 | !bVar67 * auVar124._20_4_;
            bVar67 = (bool)((byte)(uVar65 >> 6) & 1);
            auVar124._24_4_ = bVar67 * uVar134 | !bVar67 * auVar124._24_4_;
            bVar67 = SUB81(uVar65 >> 7,0);
            auVar124._28_4_ = bVar67 * uVar135 | !bVar67 * auVar124._28_4_;
            auVar93 = vblendmps_avx512vl(auVar241,auVar227);
            bVar67 = (bool)((byte)(uVar66 >> 1) & 1);
            bVar4 = (bool)((byte)(uVar66 >> 2) & 1);
            bVar5 = (bool)((byte)(uVar66 >> 3) & 1);
            bVar6 = (bool)((byte)(uVar66 >> 4) & 1);
            bVar7 = (bool)((byte)(uVar66 >> 5) & 1);
            bVar8 = (bool)((byte)(uVar66 >> 6) & 1);
            bVar9 = SUB81(uVar66 >> 7,0);
            auVar125._0_4_ =
                 (uint)(bVar62 & 1) *
                 ((uint)(bVar60 & 1) * auVar93._0_4_ | !(bool)(bVar60 & 1) * uVar68) |
                 !(bool)(bVar62 & 1) * auVar125._0_4_;
            bVar3 = (bool)((byte)(uVar65 >> 1) & 1);
            auVar125._4_4_ =
                 (uint)bVar3 * ((uint)bVar67 * auVar93._4_4_ | !bVar67 * uVar129) |
                 !bVar3 * auVar125._4_4_;
            bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
            auVar125._8_4_ =
                 (uint)bVar67 * ((uint)bVar4 * auVar93._8_4_ | !bVar4 * uVar130) |
                 !bVar67 * auVar125._8_4_;
            bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
            auVar125._12_4_ =
                 (uint)bVar67 * ((uint)bVar5 * auVar93._12_4_ | !bVar5 * uVar131) |
                 !bVar67 * auVar125._12_4_;
            bVar67 = (bool)((byte)(uVar65 >> 4) & 1);
            auVar125._16_4_ =
                 (uint)bVar67 * ((uint)bVar6 * auVar93._16_4_ | !bVar6 * uVar132) |
                 !bVar67 * auVar125._16_4_;
            bVar67 = (bool)((byte)(uVar65 >> 5) & 1);
            auVar125._20_4_ =
                 (uint)bVar67 * ((uint)bVar7 * auVar93._20_4_ | !bVar7 * uVar133) |
                 !bVar67 * auVar125._20_4_;
            bVar67 = (bool)((byte)(uVar65 >> 6) & 1);
            auVar125._24_4_ =
                 (uint)bVar67 * ((uint)bVar8 * auVar93._24_4_ | !bVar8 * uVar134) |
                 !bVar67 * auVar125._24_4_;
            bVar67 = SUB81(uVar65 >> 7,0);
            auVar125._28_4_ =
                 (uint)bVar67 * ((uint)bVar9 * auVar93._28_4_ | !bVar9 * uVar135) |
                 !bVar67 * auVar125._28_4_;
            bVar64 = (~bVar62 | bVar60) & bVar64;
          }
        }
        auVar228._0_4_ = local_480._0_4_ * auVar225._0_4_;
        auVar228._4_4_ = local_480._4_4_ * auVar225._4_4_;
        auVar228._8_4_ = local_480._8_4_ * auVar225._8_4_;
        auVar228._12_4_ = local_480._12_4_ * auVar225._12_4_;
        auVar228._16_4_ = local_480._16_4_ * auVar225._16_4_;
        auVar228._20_4_ = local_480._20_4_ * auVar225._20_4_;
        auVar228._28_36_ = auVar225._28_36_;
        auVar228._24_4_ = local_480._24_4_ * auVar225._24_4_;
        auVar242 = ZEXT3264(local_460);
        auVar71 = vfmadd231ps_fma(auVar228._0_32_,local_460,auVar83);
        auVar228 = ZEXT3264(local_440);
        auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),local_440,auVar81);
        auVar224._8_4_ = 0x7fffffff;
        auVar224._0_8_ = 0x7fffffff7fffffff;
        auVar224._12_4_ = 0x7fffffff;
        auVar224._16_4_ = 0x7fffffff;
        auVar224._20_4_ = 0x7fffffff;
        auVar224._24_4_ = 0x7fffffff;
        auVar224._28_4_ = 0x7fffffff;
        auVar225 = ZEXT3264(auVar224);
        auVar93 = vandps_avx(ZEXT1632(auVar71),auVar224);
        auVar236 = ZEXT3264(local_420);
        _local_1c0 = local_420;
        auVar223._8_4_ = 0x3e99999a;
        auVar223._0_8_ = 0x3e99999a3e99999a;
        auVar223._12_4_ = 0x3e99999a;
        auVar223._16_4_ = 0x3e99999a;
        auVar223._20_4_ = 0x3e99999a;
        auVar223._24_4_ = 0x3e99999a;
        auVar223._28_4_ = 0x3e99999a;
        uVar12 = vcmpps_avx512vl(auVar93,auVar223,1);
        _local_360 = vmaxps_avx(local_420,auVar125);
        auVar93 = vminps_avx(local_340,auVar124);
        uVar14 = vcmpps_avx512vl(local_420,auVar93,2);
        bVar62 = (byte)uVar14 & bVar59;
        _local_3e0 = _local_360;
        uVar13 = vcmpps_avx512vl(_local_360,local_340,2);
        if ((bVar59 & ((byte)uVar13 | (byte)uVar14)) == 0) {
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        }
        else {
          local_870 = (uint)(byte)((byte)uVar12 | ~bVar64);
          auVar52._4_4_ = local_480._4_4_ * auVar234._4_4_;
          auVar52._0_4_ = local_480._0_4_ * auVar234._0_4_;
          auVar52._8_4_ = local_480._8_4_ * auVar234._8_4_;
          auVar52._12_4_ = local_480._12_4_ * auVar234._12_4_;
          auVar52._16_4_ = local_480._16_4_ * auVar234._16_4_;
          auVar52._20_4_ = local_480._20_4_ * auVar234._20_4_;
          auVar52._24_4_ = local_480._24_4_ * auVar234._24_4_;
          auVar52._28_4_ = auVar93._28_4_;
          auVar71 = vfmadd213ps_fma(auVar98,local_460,auVar52);
          auVar71 = vfmadd213ps_fma(auVar82,local_440,ZEXT1632(auVar71));
          auVar93 = vandps_avx(ZEXT1632(auVar71),auVar224);
          uVar12 = vcmpps_avx512vl(auVar93,auVar223,1);
          bVar64 = (byte)uVar12 | ~bVar64;
          auVar146._8_4_ = 2;
          auVar146._0_8_ = 0x200000002;
          auVar146._12_4_ = 2;
          auVar146._16_4_ = 2;
          auVar146._20_4_ = 2;
          auVar146._24_4_ = 2;
          auVar146._28_4_ = 2;
          auVar26._8_4_ = 3;
          auVar26._0_8_ = 0x300000003;
          auVar26._12_4_ = 3;
          auVar26._16_4_ = 3;
          auVar26._20_4_ = 3;
          auVar26._24_4_ = 3;
          auVar26._28_4_ = 3;
          auVar93 = vpblendmd_avx512vl(auVar146,auVar26);
          local_320._0_4_ = (uint)(bVar64 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
          bVar67 = (bool)(bVar64 >> 1 & 1);
          local_320._4_4_ = (uint)bVar67 * auVar93._4_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 2 & 1);
          local_320._8_4_ = (uint)bVar67 * auVar93._8_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 3 & 1);
          local_320._12_4_ = (uint)bVar67 * auVar93._12_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 4 & 1);
          local_320._16_4_ = (uint)bVar67 * auVar93._16_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 5 & 1);
          local_320._20_4_ = (uint)bVar67 * auVar93._20_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar64 >> 6 & 1);
          local_320._24_4_ = (uint)bVar67 * auVar93._24_4_ | (uint)!bVar67 * 2;
          local_320._28_4_ = (uint)(bVar64 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2;
          local_380 = vpbroadcastd_avx512vl();
          uVar12 = vpcmpd_avx512vl(local_380,local_320,5);
          local_86c = (uint)bVar62;
          local_3c0 = local_420._0_4_ + (float)local_400._0_4_;
          fStack_3bc = local_420._4_4_ + (float)local_400._4_4_;
          fStack_3b8 = local_420._8_4_ + fStack_3f8;
          fStack_3b4 = local_420._12_4_ + fStack_3f4;
          fStack_3b0 = local_420._16_4_ + fStack_3f0;
          fStack_3ac = local_420._20_4_ + fStack_3ec;
          fStack_3a8 = local_420._24_4_ + fStack_3e8;
          fStack_3a4 = local_420._28_4_ + fStack_3e4;
          for (bVar62 = (byte)uVar12 & bVar62; bVar62 != 0; bVar62 = ~bVar64 & bVar62 & (byte)uVar12
              ) {
            auVar147._8_4_ = 0x7f800000;
            auVar147._0_8_ = 0x7f8000007f800000;
            auVar147._12_4_ = 0x7f800000;
            auVar147._16_4_ = 0x7f800000;
            auVar147._20_4_ = 0x7f800000;
            auVar147._24_4_ = 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar147,local_420);
            auVar126._0_4_ =
                 (uint)(bVar62 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 1 & 1);
            auVar126._4_4_ = (uint)bVar67 * auVar93._4_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 2 & 1);
            auVar126._8_4_ = (uint)bVar67 * auVar93._8_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 3 & 1);
            auVar126._12_4_ = (uint)bVar67 * auVar93._12_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 4 & 1);
            auVar126._16_4_ = (uint)bVar67 * auVar93._16_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 5 & 1);
            auVar126._20_4_ = (uint)bVar67 * auVar93._20_4_ | (uint)!bVar67 * 0x7f800000;
            auVar126._24_4_ =
                 (uint)(bVar62 >> 6) * auVar93._24_4_ | (uint)!(bool)(bVar62 >> 6) * 0x7f800000;
            auVar126._28_4_ = 0x7f800000;
            auVar93 = vshufps_avx(auVar126,auVar126,0xb1);
            auVar93 = vminps_avx(auVar126,auVar93);
            auVar82 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar82);
            auVar82 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar82);
            uVar12 = vcmpps_avx512vl(auVar126,auVar93,0);
            bVar60 = (byte)uVar12 & bVar62;
            bVar64 = bVar62;
            if (bVar60 != 0) {
              bVar64 = bVar60;
            }
            iVar15 = 0;
            for (uVar68 = (uint)bVar64; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar64 = '\x01' << ((byte)iVar15 & 0x1f);
            fVar226 = *(float *)(local_1e0 + (uint)(iVar15 << 2));
            auVar228 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
            fVar229 = local_868;
            if ((float)local_700._0_4_ < 0.0) {
              local_7c0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
              auVar225 = ZEXT1664(auVar225._0_16_);
              auVar232 = ZEXT1664(auVar232._0_16_);
              auVar236 = ZEXT1664(auVar236._0_16_);
              auVar242 = ZEXT1664(auVar242._0_16_);
              fVar229 = sqrtf((float)local_700._0_4_);
              auVar228 = ZEXT1664(local_7c0._0_16_);
              auVar248 = ZEXT3264(local_860);
              auVar247 = ZEXT3264(local_840);
              auVar246 = ZEXT3264(local_820);
            }
            uVar65 = (ulong)bVar64;
            auVar72 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar71 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar79 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar73 = vminps_avx(auVar72,auVar79);
            auVar72 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar79 = vmaxps_avx(auVar71,auVar72);
            auVar199._8_4_ = 0x7fffffff;
            auVar199._0_8_ = 0x7fffffff7fffffff;
            auVar199._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar73,auVar199);
            auVar72 = vandps_avx(auVar79,auVar199);
            auVar71 = vmaxps_avx(auVar71,auVar72);
            auVar72 = vmovshdup_avx(auVar71);
            auVar72 = vmaxss_avx(auVar72,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar72);
            fVar230 = auVar71._0_4_ * 1.9073486e-06;
            local_7a0._0_4_ = fVar229 * 1.9073486e-06;
            local_650 = vshufps_avx(auVar79,auVar79,0xff);
            uVar66 = 0;
            while( true ) {
              auVar71 = ZEXT416((uint)fVar226);
              bVar60 = (byte)uVar65;
              if (uVar66 == 5) break;
              local_7c0._0_16_ = auVar228._0_16_;
              uVar158 = auVar228._0_4_;
              auVar139._4_4_ = uVar158;
              auVar139._0_4_ = uVar158;
              auVar139._8_4_ = uVar158;
              auVar139._12_4_ = uVar158;
              auVar72 = vfmadd132ps_fma(auVar139,ZEXT816(0) << 0x40,local_6f0);
              fVar216 = 1.0 - fVar226;
              fVar206 = fVar216 * fVar216 * fVar216;
              fVar229 = fVar226 * fVar226;
              fVar198 = fVar226 * fVar229;
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar206),
                                        ZEXT416((uint)fVar198));
              fVar231 = fVar226 * fVar216;
              auVar77 = ZEXT416((uint)fVar216);
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * fVar231 * 6.0)),
                                        ZEXT416((uint)(fVar231 * fVar216)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar198),
                                        ZEXT416((uint)fVar206));
              auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * fVar216 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar226 * fVar231)));
              fVar206 = fVar206 * 0.16666667;
              fVar207 = (auVar79._0_4_ + auVar69._0_4_) * 0.16666667;
              fVar208 = (auVar73._0_4_ + auVar78._0_4_) * 0.16666667;
              fVar198 = fVar198 * 0.16666667;
              auVar176._0_4_ = fVar198 * (float)local_6e0._0_4_;
              auVar176._4_4_ = fVar198 * (float)local_6e0._4_4_;
              auVar176._8_4_ = fVar198 * fStack_6d8;
              auVar176._12_4_ = fVar198 * fStack_6d4;
              auVar209._4_4_ = fVar208;
              auVar209._0_4_ = fVar208;
              auVar209._8_4_ = fVar208;
              auVar209._12_4_ = fVar208;
              auVar79 = vfmadd132ps_fma(auVar209,auVar176,local_6a0._0_16_);
              auVar177._4_4_ = fVar207;
              auVar177._0_4_ = fVar207;
              auVar177._8_4_ = fVar207;
              auVar177._12_4_ = fVar207;
              auVar79 = vfmadd132ps_fma(auVar177,auVar79,local_6c0._0_16_);
              auVar159._4_4_ = fVar206;
              auVar159._0_4_ = fVar206;
              auVar159._8_4_ = fVar206;
              auVar159._12_4_ = fVar206;
              auVar79 = vfmadd132ps_fma(auVar159,auVar79,local_680._0_16_);
              local_580._0_16_ = auVar79;
              auVar72 = vsubps_avx(auVar72,auVar79);
              local_720._0_16_ = auVar72;
              auVar72 = vdpps_avx(auVar72,auVar72,0x7f);
              local_740._0_16_ = auVar72;
              if (auVar72._0_4_ < 0.0) {
                local_7e0._0_4_ = fVar229;
                local_800._0_4_ = fVar231;
                auVar219._0_4_ = sqrtf(auVar72._0_4_);
                auVar219._4_60_ = extraout_var;
                auVar72 = auVar219._0_16_;
                uVar65 = extraout_RAX;
                fVar231 = (float)local_800._0_4_;
              }
              else {
                auVar72 = vsqrtss_avx(auVar72,auVar72);
                local_7e0._0_4_ = fVar229;
              }
              local_5a0._4_4_ = fVar216;
              local_5a0._0_4_ = fVar216;
              fStack_598 = fVar216;
              fStack_594 = fVar216;
              auVar73 = vfnmsub213ss_fma(auVar71,auVar71,ZEXT416((uint)(fVar231 * 4.0)));
              auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * 4.0)),auVar77,auVar77);
              fVar229 = fVar216 * -fVar216 * 0.5;
              fVar231 = auVar73._0_4_ * 0.5;
              fVar206 = auVar79._0_4_ * 0.5;
              local_7e0._0_4_ = (float)local_7e0._0_4_ * 0.5;
              auVar200._0_4_ = (float)local_7e0._0_4_ * (float)local_6e0._0_4_;
              auVar200._4_4_ = (float)local_7e0._0_4_ * (float)local_6e0._4_4_;
              auVar200._8_4_ = (float)local_7e0._0_4_ * fStack_6d8;
              auVar200._12_4_ = (float)local_7e0._0_4_ * fStack_6d4;
              auVar160._4_4_ = fVar206;
              auVar160._0_4_ = fVar206;
              auVar160._8_4_ = fVar206;
              auVar160._12_4_ = fVar206;
              auVar79 = vfmadd132ps_fma(auVar160,auVar200,local_6a0._0_16_);
              auVar178._4_4_ = fVar231;
              auVar178._0_4_ = fVar231;
              auVar178._8_4_ = fVar231;
              auVar178._12_4_ = fVar231;
              auVar79 = vfmadd132ps_fma(auVar178,auVar79,local_6c0._0_16_);
              auVar238._4_4_ = fVar229;
              auVar238._0_4_ = fVar229;
              auVar238._8_4_ = fVar229;
              auVar238._12_4_ = fVar229;
              _local_7e0 = vfmadd132ps_fma(auVar238,auVar79,local_680._0_16_);
              local_5c0._0_16_ = vdpps_avx(_local_7e0,_local_7e0,0x7f);
              auVar54._12_4_ = 0;
              auVar54._0_12_ = ZEXT812(0);
              fVar229 = local_5c0._0_4_;
              local_790 = vrsqrt14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar229));
              fVar231 = local_790._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(auVar54 << 0x20,ZEXT416((uint)fVar229));
              auVar79 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar79._0_4_;
              local_800._0_4_ = auVar72._0_4_;
              if (fVar229 < -fVar229) {
                auVar225._0_4_ = sqrtf(fVar229);
                auVar225._4_60_ = extraout_var_00;
                auVar72 = ZEXT416((uint)local_800._0_4_);
                auVar73 = auVar225._0_16_;
                uVar65 = extraout_RAX_00;
                auVar79 = _local_7e0;
              }
              else {
                auVar73 = vsqrtss_avx512f(local_5c0._0_16_,local_5c0._0_16_);
                auVar79 = _local_7e0;
              }
              fVar206 = local_790._0_4_;
              fVar229 = fVar231 * 1.5 + fVar229 * -0.5 * fVar206 * fVar206 * fVar206;
              local_790._0_4_ = auVar79._0_4_ * fVar229;
              local_790._4_4_ = auVar79._4_4_ * fVar229;
              local_790._8_4_ = auVar79._8_4_ * fVar229;
              local_790._12_4_ = auVar79._12_4_ * fVar229;
              auVar69 = vdpps_avx(local_720._0_16_,local_790,0x7f);
              fVar207 = auVar72._0_4_;
              fVar231 = auVar69._0_4_;
              auVar140._0_4_ = fVar231 * fVar231;
              auVar140._4_4_ = auVar69._4_4_ * auVar69._4_4_;
              auVar140._8_4_ = auVar69._8_4_ * auVar69._8_4_;
              auVar140._12_4_ = auVar69._12_4_ * auVar69._12_4_;
              auVar78 = vsubps_avx(local_740._0_16_,auVar140);
              fVar206 = auVar78._0_4_;
              auVar161._4_12_ = ZEXT812(0) << 0x20;
              auVar161._0_4_ = fVar206;
              auVar70 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar161);
              auVar74 = vmulss_avx512f(auVar70,ZEXT416(0x3fc00000));
              auVar75 = vmulss_avx512f(auVar78,ZEXT416(0xbf000000));
              if (fVar206 < 0.0) {
                local_620._0_4_ = auVar74._0_4_;
                local_640 = fVar229;
                fStack_63c = fVar229;
                fStack_638 = fVar229;
                fStack_634 = fVar229;
                local_630 = auVar70;
                fVar206 = sqrtf(fVar206);
                auVar75 = ZEXT416(auVar75._0_4_);
                auVar74 = ZEXT416((uint)local_620._0_4_);
                auVar73 = ZEXT416(auVar73._0_4_);
                auVar72 = ZEXT416((uint)local_800._0_4_);
                uVar65 = extraout_RAX_01;
                auVar79 = _local_7e0;
                auVar70 = local_630;
                fVar229 = local_640;
                fVar208 = fStack_63c;
                fVar198 = fStack_638;
                fVar216 = fStack_634;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                fVar206 = auVar78._0_4_;
                fVar208 = fVar229;
                fVar198 = fVar229;
                fVar216 = fVar229;
              }
              auVar242 = ZEXT1664(auVar79);
              auVar236 = ZEXT1664(local_740._0_16_);
              auVar232 = ZEXT1664(local_720._0_16_);
              auVar246 = ZEXT3264(local_820);
              auVar247 = ZEXT3264(local_840);
              auVar248 = ZEXT3264(local_860);
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar77,auVar71);
              auVar71 = vfmadd231ss_fma(auVar77,auVar71,SUB6416(ZEXT464(0xc0000000),0));
              auVar179._0_4_ = fVar226 * (float)local_6e0._0_4_;
              auVar179._4_4_ = fVar226 * (float)local_6e0._4_4_;
              auVar179._8_4_ = fVar226 * fStack_6d8;
              auVar179._12_4_ = fVar226 * fStack_6d4;
              auVar201._0_4_ = auVar71._0_4_;
              auVar201._4_4_ = auVar201._0_4_;
              auVar201._8_4_ = auVar201._0_4_;
              auVar201._12_4_ = auVar201._0_4_;
              auVar71 = vfmadd132ps_fma(auVar201,auVar179,local_6a0._0_16_);
              auVar162._0_4_ = auVar78._0_4_;
              auVar162._4_4_ = auVar162._0_4_;
              auVar162._8_4_ = auVar162._0_4_;
              auVar162._12_4_ = auVar162._0_4_;
              auVar71 = vfmadd132ps_fma(auVar162,auVar71,local_6c0._0_16_);
              auVar71 = vfmadd132ps_fma(_local_5a0,auVar71,local_680._0_16_);
              auVar163._0_4_ = auVar71._0_4_ * (float)local_5c0._0_4_;
              auVar163._4_4_ = auVar71._4_4_ * (float)local_5c0._0_4_;
              auVar163._8_4_ = auVar71._8_4_ * (float)local_5c0._0_4_;
              auVar163._12_4_ = auVar71._12_4_ * (float)local_5c0._0_4_;
              auVar71 = vdpps_avx(auVar79,auVar71,0x7f);
              fVar175 = auVar71._0_4_;
              auVar180._0_4_ = auVar79._0_4_ * fVar175;
              auVar180._4_4_ = auVar79._4_4_ * fVar175;
              auVar180._8_4_ = auVar79._8_4_ * fVar175;
              auVar180._12_4_ = auVar79._12_4_ * fVar175;
              auVar71 = vsubps_avx(auVar163,auVar180);
              fVar175 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar17._8_4_ = 0x80000000;
              auVar17._0_8_ = 0x8000000080000000;
              auVar17._12_4_ = 0x80000000;
              auVar76 = vxorps_avx512vl(auVar79,auVar17);
              auVar210._0_4_ = fVar229 * auVar71._0_4_ * fVar175;
              auVar210._4_4_ = fVar208 * auVar71._4_4_ * fVar175;
              auVar210._8_4_ = fVar198 * auVar71._8_4_ * fVar175;
              auVar210._12_4_ = fVar216 * auVar71._12_4_ * fVar175;
              auVar71 = vdpps_avx(auVar76,local_790,0x7f);
              auVar78 = vmaxss_avx(ZEXT416((uint)fVar230),
                                   ZEXT416((uint)((float)local_7c0._0_4_ * (float)local_7a0._0_4_)))
              ;
              auVar77 = vdivss_avx512f(ZEXT416((uint)fVar230),auVar73);
              auVar73 = vdpps_avx(local_720._0_16_,auVar210,0x7f);
              auVar72 = vfmadd213ss_fma(auVar72,ZEXT416((uint)fVar230),auVar78);
              auVar77 = vfmadd213ss_fma(ZEXT416((uint)(fVar207 + 1.0)),auVar77,auVar72);
              auVar72 = vdpps_avx(local_6f0,local_790,0x7f);
              fVar229 = auVar71._0_4_ + auVar73._0_4_;
              auVar71 = vdpps_avx(local_720._0_16_,auVar76,0x7f);
              auVar75 = vmulss_avx512f(auVar75,auVar70);
              auVar70 = vmulss_avx512f(auVar70,auVar70);
              auVar73 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
              auVar75 = vaddss_avx512f(auVar74,ZEXT416((uint)(auVar75._0_4_ * auVar70._0_4_)));
              auVar70 = vfnmadd231ss_fma(auVar71,auVar69,ZEXT416((uint)fVar229));
              auVar74 = vfnmadd231ss_fma(auVar73,auVar69,auVar72);
              auVar71 = vpermilps_avx(local_580._0_16_,0xff);
              fVar206 = fVar206 - auVar71._0_4_;
              auVar71 = vshufps_avx(auVar79,auVar79,0xff);
              auVar73 = vfmsub213ss_fma(auVar70,auVar75,auVar71);
              fVar207 = auVar74._0_4_ * auVar75._0_4_;
              auVar70 = vfmsub231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar73._0_4_)),
                                        ZEXT416((uint)fVar229),ZEXT416((uint)fVar207));
              auVar225 = ZEXT1664(auVar70);
              fVar208 = auVar70._0_4_;
              fVar226 = fVar226 - (fVar231 * (fVar207 / fVar208) -
                                  fVar206 * (auVar72._0_4_ / fVar208));
              fVar229 = (float)local_7c0._0_4_ -
                        (fVar206 * (fVar229 / fVar208) - fVar231 * (auVar73._0_4_ / fVar208));
              auVar228 = ZEXT464((uint)fVar229);
              auVar18._8_4_ = 0x7fffffff;
              auVar18._0_8_ = 0x7fffffff7fffffff;
              auVar18._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(auVar69,auVar18);
              if (auVar72._0_4_ < auVar77._0_4_) {
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ + auVar78._0_4_)),local_650,
                                          ZEXT416(0x36000000));
                auVar19._8_4_ = 0x7fffffff;
                auVar19._0_8_ = 0x7fffffff7fffffff;
                auVar19._12_4_ = 0x7fffffff;
                auVar73 = vandps_avx512vl(ZEXT416((uint)fVar206),auVar19);
                if (auVar73._0_4_ < auVar72._0_4_) {
                  bVar67 = uVar66 < 5;
                  fVar230 = fVar229 + (float)local_660._0_4_;
                  if ((fVar136 <= fVar230) &&
                     (fVar231 = *(float *)(ray + k * 4 + 0x80), fVar230 <= fVar231)) {
                    bVar60 = 0;
                    if ((fVar226 < 0.0) || (1.0 < fVar226)) goto LAB_01a9d027;
                    auVar181._4_12_ = SUB1612(ZEXT816(0),0);
                    auVar181._0_4_ = local_740._0_4_;
                    auVar72 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar181);
                    fVar206 = auVar72._0_4_;
                    pGVar1 = (context->scene->geometries).items[local_878].ptr;
                    if ((pGVar1->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar60 = 1, pGVar1->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01a9d027;
                      fVar206 = fVar206 * 1.5 + local_740._0_4_ * -0.5 * fVar206 * fVar206 * fVar206
                      ;
                      auVar182._0_4_ = local_720._0_4_ * fVar206;
                      auVar182._4_4_ = local_720._4_4_ * fVar206;
                      auVar182._8_4_ = local_720._8_4_ * fVar206;
                      auVar182._12_4_ = local_720._12_4_ * fVar206;
                      auVar69 = vfmadd213ps_fma(auVar71,auVar182,auVar79);
                      auVar71 = vshufps_avx(auVar182,auVar182,0xc9);
                      auVar72 = vshufps_avx(auVar79,auVar79,0xc9);
                      auVar183._0_4_ = auVar182._0_4_ * auVar72._0_4_;
                      auVar183._4_4_ = auVar182._4_4_ * auVar72._4_4_;
                      auVar183._8_4_ = auVar182._8_4_ * auVar72._8_4_;
                      auVar183._12_4_ = auVar182._12_4_ * auVar72._12_4_;
                      auVar73 = vfmsub231ps_fma(auVar183,auVar79,auVar71);
                      auVar71 = vshufps_avx(auVar73,auVar73,0xc9);
                      auVar72 = vshufps_avx(auVar69,auVar69,0xc9);
                      auVar73 = vshufps_avx(auVar73,auVar73,0xd2);
                      auVar141._0_4_ = auVar69._0_4_ * auVar73._0_4_;
                      auVar141._4_4_ = auVar69._4_4_ * auVar73._4_4_;
                      auVar141._8_4_ = auVar69._8_4_ * auVar73._8_4_;
                      auVar141._12_4_ = auVar69._12_4_ * auVar73._12_4_;
                      auVar71 = vfmsub231ps_fma(auVar141,auVar71,auVar72);
                      local_520 = (RTCHitN  [16])vshufps_avx(auVar71,auVar71,0x55);
                      auStack_510 = vshufps_avx(auVar71,auVar71,0xaa);
                      local_500 = auVar71._0_4_;
                      uStack_4fc = local_500;
                      uStack_4f8 = local_500;
                      uStack_4f4 = local_500;
                      local_4f0 = fVar226;
                      fStack_4ec = fVar226;
                      fStack_4e8 = fVar226;
                      fStack_4e4 = fVar226;
                      local_4e0 = ZEXT416(0) << 0x20;
                      local_4d0 = local_530._0_8_;
                      uStack_4c8 = local_530._8_8_;
                      local_4c0 = local_540;
                      vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                      uStack_4ac = context->user->instID[0];
                      local_4b0 = uStack_4ac;
                      uStack_4a8 = uStack_4ac;
                      uStack_4a4 = uStack_4ac;
                      uStack_4a0 = context->user->instPrimID[0];
                      uStack_49c = uStack_4a0;
                      uStack_498 = uStack_4a0;
                      uStack_494 = uStack_4a0;
                      *(float *)(ray + k * 4 + 0x80) = fVar230;
                      local_890 = local_550;
                      local_770.valid = (int *)local_890;
                      local_770.geometryUserPtr = pGVar1->userPtr;
                      local_770.context = context->user;
                      local_770.hit = local_520;
                      local_770.N = 4;
                      local_770.ray = (RTCRayN *)ray;
                      if (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar225 = ZEXT1664(auVar70);
                        auVar228 = ZEXT464((uint)fVar229);
                        auVar232 = ZEXT1664(local_720._0_16_);
                        auVar236 = ZEXT1664(local_740._0_16_);
                        auVar242 = ZEXT1664(auVar79);
                        (*pGVar1->occlusionFilterN)(&local_770);
                        auVar248 = ZEXT3264(local_860);
                        auVar247 = ZEXT3264(local_840);
                        auVar246 = ZEXT3264(local_820);
                      }
                      uVar65 = vptestmd_avx512vl(local_890,local_890);
                      if ((uVar65 & 0xf) != 0) {
                        p_Var2 = context->args->filter;
                        if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar1->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar225 = ZEXT1664(auVar225._0_16_);
                          auVar228 = ZEXT1664(auVar228._0_16_);
                          auVar232 = ZEXT1664(auVar232._0_16_);
                          auVar236 = ZEXT1664(auVar236._0_16_);
                          auVar242 = ZEXT1664(auVar242._0_16_);
                          (*p_Var2)(&local_770);
                          auVar248 = ZEXT3264(local_860);
                          auVar247 = ZEXT3264(local_840);
                          auVar246 = ZEXT3264(local_820);
                        }
                        uVar65 = vptestmd_avx512vl(local_890,local_890);
                        uVar65 = uVar65 & 0xf;
                        auVar71 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar3 = (bool)((byte)uVar65 & 1);
                        bVar4 = (bool)((byte)(uVar65 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar65 >> 2) & 1);
                        bVar6 = SUB81(uVar65 >> 3,0);
                        *(uint *)(local_770.ray + 0x80) =
                             (uint)bVar3 * auVar71._0_4_ |
                             (uint)!bVar3 * *(int *)(local_770.ray + 0x80);
                        *(uint *)(local_770.ray + 0x84) =
                             (uint)bVar4 * auVar71._4_4_ |
                             (uint)!bVar4 * *(int *)(local_770.ray + 0x84);
                        *(uint *)(local_770.ray + 0x88) =
                             (uint)bVar5 * auVar71._8_4_ |
                             (uint)!bVar5 * *(int *)(local_770.ray + 0x88);
                        *(uint *)(local_770.ray + 0x8c) =
                             (uint)bVar6 * auVar71._12_4_ |
                             (uint)!bVar6 * *(int *)(local_770.ray + 0x8c);
                        bVar60 = 1;
                        if ((byte)uVar65 != 0) goto LAB_01a9d027;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar231;
                    }
                  }
                  bVar60 = 0;
                  goto LAB_01a9d027;
                }
              }
              uVar66 = uVar66 + 1;
            }
            bVar67 = false;
LAB_01a9d027:
            bVar61 = bVar61 | bVar67 & bVar60;
            uVar158 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar217._4_4_ = uVar158;
            auVar217._0_4_ = uVar158;
            auVar217._8_4_ = uVar158;
            auVar217._12_4_ = uVar158;
            auVar217._16_4_ = uVar158;
            auVar217._20_4_ = uVar158;
            auVar217._24_4_ = uVar158;
            auVar217._28_4_ = uVar158;
            auVar219 = ZEXT3264(auVar217);
            auVar56._4_4_ = fStack_3bc;
            auVar56._0_4_ = local_3c0;
            auVar56._8_4_ = fStack_3b8;
            auVar56._12_4_ = fStack_3b4;
            auVar56._16_4_ = fStack_3b0;
            auVar56._20_4_ = fStack_3ac;
            auVar56._24_4_ = fStack_3a8;
            auVar56._28_4_ = fStack_3a4;
            uVar12 = vcmpps_avx512vl(auVar217,auVar56,0xd);
          }
          auVar148._0_4_ = (float)local_400._0_4_ + (float)local_3e0._0_4_;
          auVar148._4_4_ = (float)local_400._4_4_ + (float)local_3e0._4_4_;
          auVar148._8_4_ = fStack_3f8 + fStack_3d8;
          auVar148._12_4_ = fStack_3f4 + fStack_3d4;
          auVar148._16_4_ = fStack_3f0 + fStack_3d0;
          auVar148._20_4_ = fStack_3ec + fStack_3cc;
          auVar148._24_4_ = fStack_3e8 + fStack_3c8;
          auVar148._28_4_ = fStack_3e4 + fStack_3c4;
          uVar158 = auVar219._0_4_;
          auVar170._4_4_ = uVar158;
          auVar170._0_4_ = uVar158;
          auVar170._8_4_ = uVar158;
          auVar170._12_4_ = uVar158;
          auVar170._16_4_ = uVar158;
          auVar170._20_4_ = uVar158;
          auVar170._24_4_ = uVar158;
          auVar170._28_4_ = uVar158;
          uVar12 = vcmpps_avx512vl(auVar148,auVar170,2);
          auVar149._8_4_ = 2;
          auVar149._0_8_ = 0x200000002;
          auVar149._12_4_ = 2;
          auVar149._16_4_ = 2;
          auVar149._20_4_ = 2;
          auVar149._24_4_ = 2;
          auVar149._28_4_ = 2;
          auVar27._8_4_ = 3;
          auVar27._0_8_ = 0x300000003;
          auVar27._12_4_ = 3;
          auVar27._16_4_ = 3;
          auVar27._20_4_ = 3;
          auVar27._24_4_ = 3;
          auVar27._28_4_ = 3;
          auVar93 = vpblendmd_avx512vl(auVar149,auVar27);
          bVar67 = (bool)((byte)local_870 & 1);
          local_3e0._0_4_ = (uint)bVar67 * auVar93._0_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)((byte)(local_870 >> 1) & 1);
          local_3e0._4_4_ = (uint)bVar67 * auVar93._4_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)((byte)(local_870 >> 2) & 1);
          fStack_3d8 = (float)((uint)bVar67 * auVar93._8_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_870 >> 3) & 1);
          fStack_3d4 = (float)((uint)bVar67 * auVar93._12_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_870 >> 4) & 1);
          fStack_3d0 = (float)((uint)bVar67 * auVar93._16_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_870 >> 5) & 1);
          fStack_3cc = (float)((uint)bVar67 * auVar93._20_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_870 >> 6) & 1);
          fStack_3c8 = (float)((uint)bVar67 * auVar93._24_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)((byte)(local_870 >> 7) & 1);
          fStack_3c4 = (float)((uint)bVar67 * auVar93._28_4_ | (uint)!bVar67 * 2);
          bVar59 = (byte)uVar13 & bVar59 & (byte)uVar12;
          uVar12 = vpcmpd_avx512vl(_local_3e0,local_380,2);
          local_420 = _local_360;
          local_3c0 = (float)local_400._0_4_ + (float)local_360._0_4_;
          fStack_3bc = (float)local_400._4_4_ + (float)local_360._4_4_;
          fStack_3b8 = fStack_3f8 + fStack_358;
          fStack_3b4 = fStack_3f4 + fStack_354;
          fStack_3b0 = fStack_3f0 + fStack_350;
          fStack_3ac = fStack_3ec + fStack_34c;
          fStack_3a8 = fStack_3e8 + fStack_348;
          fStack_3a4 = fStack_3e4 + fStack_344;
          for (bVar64 = (byte)uVar12 & bVar59; bVar64 != 0; bVar64 = ~bVar62 & bVar64 & (byte)uVar12
              ) {
            auVar150._8_4_ = 0x7f800000;
            auVar150._0_8_ = 0x7f8000007f800000;
            auVar150._12_4_ = 0x7f800000;
            auVar150._16_4_ = 0x7f800000;
            auVar150._20_4_ = 0x7f800000;
            auVar150._24_4_ = 0x7f800000;
            auVar150._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar150,local_420);
            auVar127._0_4_ =
                 (uint)(bVar64 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 1 & 1);
            auVar127._4_4_ = (uint)bVar67 * auVar93._4_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 2 & 1);
            auVar127._8_4_ = (uint)bVar67 * auVar93._8_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 3 & 1);
            auVar127._12_4_ = (uint)bVar67 * auVar93._12_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 4 & 1);
            auVar127._16_4_ = (uint)bVar67 * auVar93._16_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar64 >> 5 & 1);
            auVar127._20_4_ = (uint)bVar67 * auVar93._20_4_ | (uint)!bVar67 * 0x7f800000;
            auVar127._24_4_ =
                 (uint)(bVar64 >> 6) * auVar93._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
            auVar127._28_4_ = 0x7f800000;
            auVar93 = vshufps_avx(auVar127,auVar127,0xb1);
            auVar93 = vminps_avx(auVar127,auVar93);
            auVar82 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar82);
            auVar82 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar82);
            uVar12 = vcmpps_avx512vl(auVar127,auVar93,0);
            bVar60 = (byte)uVar12 & bVar64;
            bVar62 = bVar64;
            if (bVar60 != 0) {
              bVar62 = bVar60;
            }
            iVar15 = 0;
            for (uVar68 = (uint)bVar62; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar62 = '\x01' << ((byte)iVar15 & 0x1f);
            fVar226 = *(float *)(local_200 + (uint)(iVar15 << 2));
            auVar228 = ZEXT464(*(uint *)(local_340 + (uint)(iVar15 << 2)));
            fVar229 = local_864;
            if ((float)local_700._0_4_ < 0.0) {
              local_7c0._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar15 << 2)));
              auVar225 = ZEXT1664(auVar225._0_16_);
              auVar232 = ZEXT1664(auVar232._0_16_);
              auVar236 = ZEXT1664(auVar236._0_16_);
              auVar242 = ZEXT1664(auVar242._0_16_);
              fVar229 = sqrtf((float)local_700._0_4_);
              auVar228 = ZEXT1664(local_7c0._0_16_);
              auVar248 = ZEXT3264(local_860);
              auVar247 = ZEXT3264(local_840);
              auVar246 = ZEXT3264(local_820);
            }
            uVar65 = (ulong)bVar62;
            auVar72 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar71 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar79 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar73 = vminps_avx(auVar72,auVar79);
            auVar72 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar79 = vmaxps_avx(auVar71,auVar72);
            auVar202._8_4_ = 0x7fffffff;
            auVar202._0_8_ = 0x7fffffff7fffffff;
            auVar202._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar73,auVar202);
            auVar72 = vandps_avx(auVar79,auVar202);
            auVar71 = vmaxps_avx(auVar71,auVar72);
            auVar72 = vmovshdup_avx(auVar71);
            auVar72 = vmaxss_avx(auVar72,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar72);
            local_790._0_4_ = auVar71._0_4_ * 1.9073486e-06;
            local_650 = vshufps_avx(auVar79,auVar79,0xff);
            uVar66 = 0;
            while( true ) {
              auVar71 = ZEXT416((uint)fVar226);
              bVar60 = (byte)uVar65;
              if (uVar66 == 5) break;
              local_7c0._0_16_ = auVar228._0_16_;
              uVar158 = auVar228._0_4_;
              auVar142._4_4_ = uVar158;
              auVar142._0_4_ = uVar158;
              auVar142._8_4_ = uVar158;
              auVar142._12_4_ = uVar158;
              auVar72 = vfmadd132ps_fma(auVar142,ZEXT816(0) << 0x40,local_6f0);
              fVar216 = 1.0 - fVar226;
              fVar206 = fVar216 * fVar216 * fVar216;
              fVar230 = fVar226 * fVar226;
              fVar198 = fVar226 * fVar230;
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar206),
                                        ZEXT416((uint)fVar198));
              fVar231 = fVar226 * fVar216;
              auVar77 = ZEXT416((uint)fVar216);
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * fVar231 * 6.0)),
                                        ZEXT416((uint)(fVar231 * fVar216)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar198),
                                        ZEXT416((uint)fVar206));
              auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * fVar216 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar226 * fVar231)));
              fVar206 = fVar206 * 0.16666667;
              fVar207 = (auVar79._0_4_ + auVar69._0_4_) * 0.16666667;
              fVar208 = (auVar73._0_4_ + auVar78._0_4_) * 0.16666667;
              fVar198 = fVar198 * 0.16666667;
              auVar184._0_4_ = fVar198 * (float)local_6e0._0_4_;
              auVar184._4_4_ = fVar198 * (float)local_6e0._4_4_;
              auVar184._8_4_ = fVar198 * fStack_6d8;
              auVar184._12_4_ = fVar198 * fStack_6d4;
              auVar211._4_4_ = fVar208;
              auVar211._0_4_ = fVar208;
              auVar211._8_4_ = fVar208;
              auVar211._12_4_ = fVar208;
              auVar79 = vfmadd132ps_fma(auVar211,auVar184,local_6a0._0_16_);
              auVar185._4_4_ = fVar207;
              auVar185._0_4_ = fVar207;
              auVar185._8_4_ = fVar207;
              auVar185._12_4_ = fVar207;
              auVar79 = vfmadd132ps_fma(auVar185,auVar79,local_6c0._0_16_);
              auVar164._4_4_ = fVar206;
              auVar164._0_4_ = fVar206;
              auVar164._8_4_ = fVar206;
              auVar164._12_4_ = fVar206;
              auVar79 = vfmadd132ps_fma(auVar164,auVar79,local_680._0_16_);
              local_580._0_16_ = auVar79;
              auVar72 = vsubps_avx(auVar72,auVar79);
              local_720._0_16_ = auVar72;
              auVar72 = vdpps_avx(auVar72,auVar72,0x7f);
              local_740._0_16_ = auVar72;
              if (auVar72._0_4_ < 0.0) {
                local_7e0._0_4_ = fVar230;
                local_800._0_4_ = fVar231;
                auVar232._0_4_ = sqrtf(auVar72._0_4_);
                auVar232._4_60_ = extraout_var_01;
                auVar72 = auVar232._0_16_;
                uVar65 = extraout_RAX_02;
                fVar231 = (float)local_800._0_4_;
              }
              else {
                auVar72 = vsqrtss_avx(auVar72,auVar72);
                local_7e0._0_4_ = fVar230;
              }
              local_5a0._4_4_ = fVar216;
              local_5a0._0_4_ = fVar216;
              fStack_598 = fVar216;
              fStack_594 = fVar216;
              auVar73 = vfnmsub213ss_fma(auVar71,auVar71,ZEXT416((uint)(fVar231 * 4.0)));
              auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar231 * 4.0)),auVar77,auVar77);
              fVar230 = fVar216 * -fVar216 * 0.5;
              fVar231 = auVar73._0_4_ * 0.5;
              fVar206 = auVar79._0_4_ * 0.5;
              local_7e0._0_4_ = (float)local_7e0._0_4_ * 0.5;
              auVar203._0_4_ = (float)local_7e0._0_4_ * (float)local_6e0._0_4_;
              auVar203._4_4_ = (float)local_7e0._0_4_ * (float)local_6e0._4_4_;
              auVar203._8_4_ = (float)local_7e0._0_4_ * fStack_6d8;
              auVar203._12_4_ = (float)local_7e0._0_4_ * fStack_6d4;
              auVar165._4_4_ = fVar206;
              auVar165._0_4_ = fVar206;
              auVar165._8_4_ = fVar206;
              auVar165._12_4_ = fVar206;
              auVar79 = vfmadd132ps_fma(auVar165,auVar203,local_6a0._0_16_);
              auVar186._4_4_ = fVar231;
              auVar186._0_4_ = fVar231;
              auVar186._8_4_ = fVar231;
              auVar186._12_4_ = fVar231;
              auVar79 = vfmadd132ps_fma(auVar186,auVar79,local_6c0._0_16_);
              auVar239._4_4_ = fVar230;
              auVar239._0_4_ = fVar230;
              auVar239._8_4_ = fVar230;
              auVar239._12_4_ = fVar230;
              _local_7e0 = vfmadd132ps_fma(auVar239,auVar79,local_680._0_16_);
              local_5c0._0_16_ = vdpps_avx(_local_7e0,_local_7e0,0x7f);
              auVar55._12_4_ = 0;
              auVar55._0_12_ = ZEXT812(0);
              fVar230 = local_5c0._0_4_;
              auVar73 = vrsqrt14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar230));
              local_5e0._0_16_ = vrcp14ss_avx512f(auVar55 << 0x20,ZEXT416((uint)fVar230));
              auVar79 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar79._0_4_;
              local_800._0_4_ = auVar72._0_4_;
              if (fVar230 < -fVar230) {
                local_7a0 = auVar73;
                auVar236._0_4_ = sqrtf(fVar230);
                auVar236._4_60_ = extraout_var_02;
                auVar72 = ZEXT416((uint)local_800._0_4_);
                auVar78 = auVar236._0_16_;
                uVar65 = extraout_RAX_03;
                auVar79 = local_7a0;
                auVar69 = _local_7e0;
              }
              else {
                auVar78 = vsqrtss_avx512f(local_5c0._0_16_,local_5c0._0_16_);
                auVar79 = auVar73;
                auVar69 = _local_7e0;
              }
              fVar231 = auVar79._0_4_;
              fVar230 = auVar73._0_4_ * 1.5 + fVar230 * -0.5 * fVar231 * fVar231 * fVar231;
              auVar245._0_4_ = auVar69._0_4_ * fVar230;
              auVar245._4_4_ = auVar69._4_4_ * fVar230;
              auVar245._8_4_ = auVar69._8_4_ * fVar230;
              auVar245._12_4_ = auVar69._12_4_ * fVar230;
              auVar79 = vdpps_avx(local_720._0_16_,auVar245,0x7f);
              fVar231 = auVar72._0_4_ + 1.0;
              fVar206 = auVar79._0_4_;
              auVar143._0_4_ = fVar206 * fVar206;
              auVar143._4_4_ = auVar79._4_4_ * auVar79._4_4_;
              auVar143._8_4_ = auVar79._8_4_ * auVar79._8_4_;
              auVar143._12_4_ = auVar79._12_4_ * auVar79._12_4_;
              auVar73 = vsubps_avx(local_740._0_16_,auVar143);
              fVar207 = auVar73._0_4_;
              auVar166._4_12_ = ZEXT812(0) << 0x20;
              auVar166._0_4_ = fVar207;
              auVar70 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar166);
              auVar74 = vmulss_avx512f(auVar70,ZEXT416(0x3fc00000));
              auVar75 = vmulss_avx512f(auVar73,ZEXT416(0xbf000000));
              if (fVar207 < 0.0) {
                local_7a0._0_4_ = fVar231;
                local_640 = fVar230;
                fStack_63c = fVar230;
                fStack_638 = fVar230;
                fStack_634 = fVar230;
                local_630 = auVar245;
                local_620 = auVar70;
                fVar207 = sqrtf(fVar207);
                auVar75 = ZEXT416(auVar75._0_4_);
                auVar74 = ZEXT416(auVar74._0_4_);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar72 = ZEXT416((uint)local_800._0_4_);
                uVar65 = extraout_RAX_04;
                auVar69 = _local_7e0;
                fVar231 = (float)local_7a0._0_4_;
                auVar245 = local_630;
                auVar70 = local_620;
                fVar230 = local_640;
                fVar208 = fStack_63c;
                fVar198 = fStack_638;
                fVar216 = fStack_634;
              }
              else {
                auVar73 = vsqrtss_avx(auVar73,auVar73);
                fVar207 = auVar73._0_4_;
                fVar208 = fVar230;
                fVar198 = fVar230;
                fVar216 = fVar230;
              }
              auVar242 = ZEXT1664(auVar69);
              auVar236 = ZEXT1664(local_740._0_16_);
              auVar232 = ZEXT1664(local_720._0_16_);
              auVar246 = ZEXT3264(local_820);
              auVar247 = ZEXT3264(local_840);
              auVar248 = ZEXT3264(local_860);
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar77,auVar71);
              auVar71 = vfmadd231ss_fma(auVar77,auVar71,SUB6416(ZEXT464(0xc0000000),0));
              auVar187._0_4_ = fVar226 * (float)local_6e0._0_4_;
              auVar187._4_4_ = fVar226 * (float)local_6e0._4_4_;
              auVar187._8_4_ = fVar226 * fStack_6d8;
              auVar187._12_4_ = fVar226 * fStack_6d4;
              auVar204._0_4_ = auVar71._0_4_;
              auVar204._4_4_ = auVar204._0_4_;
              auVar204._8_4_ = auVar204._0_4_;
              auVar204._12_4_ = auVar204._0_4_;
              auVar71 = vfmadd132ps_fma(auVar204,auVar187,local_6a0._0_16_);
              auVar167._0_4_ = auVar73._0_4_;
              auVar167._4_4_ = auVar167._0_4_;
              auVar167._8_4_ = auVar167._0_4_;
              auVar167._12_4_ = auVar167._0_4_;
              auVar71 = vfmadd132ps_fma(auVar167,auVar71,local_6c0._0_16_);
              auVar71 = vfmadd132ps_fma(_local_5a0,auVar71,local_680._0_16_);
              auVar168._0_4_ = auVar71._0_4_ * (float)local_5c0._0_4_;
              auVar168._4_4_ = auVar71._4_4_ * (float)local_5c0._0_4_;
              auVar168._8_4_ = auVar71._8_4_ * (float)local_5c0._0_4_;
              auVar168._12_4_ = auVar71._12_4_ * (float)local_5c0._0_4_;
              auVar71 = vdpps_avx(auVar69,auVar71,0x7f);
              fVar175 = auVar71._0_4_;
              auVar188._0_4_ = auVar69._0_4_ * fVar175;
              auVar188._4_4_ = auVar69._4_4_ * fVar175;
              auVar188._8_4_ = auVar69._8_4_ * fVar175;
              auVar188._12_4_ = auVar69._12_4_ * fVar175;
              auVar71 = vsubps_avx(auVar168,auVar188);
              fVar175 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar76 = vxorps_avx512vl(auVar69,auVar20);
              auVar212._0_4_ = fVar230 * auVar71._0_4_ * fVar175;
              auVar212._4_4_ = fVar208 * auVar71._4_4_ * fVar175;
              auVar212._8_4_ = fVar198 * auVar71._8_4_ * fVar175;
              auVar212._12_4_ = fVar216 * auVar71._12_4_ * fVar175;
              auVar71 = vdpps_avx(auVar76,auVar245,0x7f);
              auVar77 = vmaxss_avx(ZEXT416((uint)local_790._0_4_),
                                   ZEXT416((uint)((float)local_7c0._0_4_ * fVar229 * 1.9073486e-06))
                                  );
              auVar78 = vdivss_avx512f(ZEXT416((uint)local_790._0_4_),auVar78);
              auVar73 = vdpps_avx(local_720._0_16_,auVar212,0x7f);
              auVar72 = vfmadd213ss_fma(auVar72,ZEXT416((uint)local_790._0_4_),auVar77);
              auVar78 = vfmadd213ss_fma(ZEXT416((uint)fVar231),auVar78,auVar72);
              auVar72 = vdpps_avx(local_6f0,auVar245,0x7f);
              fVar230 = auVar71._0_4_ + auVar73._0_4_;
              auVar71 = vdpps_avx(local_720._0_16_,auVar76,0x7f);
              auVar75 = vmulss_avx512f(auVar75,auVar70);
              auVar70 = vmulss_avx512f(auVar70,auVar70);
              auVar73 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
              auVar75 = vaddss_avx512f(auVar74,ZEXT416((uint)(auVar75._0_4_ * auVar70._0_4_)));
              auVar70 = vfnmadd231ss_fma(auVar71,auVar79,ZEXT416((uint)fVar230));
              auVar74 = vfnmadd231ss_fma(auVar73,auVar79,auVar72);
              auVar71 = vpermilps_avx(local_580._0_16_,0xff);
              fVar207 = fVar207 - auVar71._0_4_;
              auVar71 = vshufps_avx(auVar69,auVar69,0xff);
              auVar73 = vfmsub213ss_fma(auVar70,auVar75,auVar71);
              fVar231 = auVar74._0_4_ * auVar75._0_4_;
              auVar70 = vfmsub231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar73._0_4_)),
                                        ZEXT416((uint)fVar230),ZEXT416((uint)fVar231));
              auVar225 = ZEXT1664(auVar70);
              fVar208 = auVar70._0_4_;
              fVar226 = fVar226 - (fVar206 * (fVar231 / fVar208) -
                                  fVar207 * (auVar72._0_4_ / fVar208));
              fVar230 = (float)local_7c0._0_4_ -
                        (fVar207 * (fVar230 / fVar208) - fVar206 * (auVar73._0_4_ / fVar208));
              auVar228 = ZEXT464((uint)fVar230);
              auVar21._8_4_ = 0x7fffffff;
              auVar21._0_8_ = 0x7fffffff7fffffff;
              auVar21._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(auVar79,auVar21);
              if (auVar72._0_4_ < auVar78._0_4_) {
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar77._0_4_)),local_650,
                                          ZEXT416(0x36000000));
                auVar22._8_4_ = 0x7fffffff;
                auVar22._0_8_ = 0x7fffffff7fffffff;
                auVar22._12_4_ = 0x7fffffff;
                auVar79 = vandps_avx512vl(ZEXT416((uint)fVar207),auVar22);
                if (auVar79._0_4_ < auVar72._0_4_) {
                  bVar67 = uVar66 < 5;
                  fVar229 = fVar230 + (float)local_660._0_4_;
                  if ((fVar136 <= fVar229) &&
                     (fVar231 = *(float *)(ray + k * 4 + 0x80), fVar229 <= fVar231)) {
                    bVar60 = 0;
                    if ((fVar226 < 0.0) || (1.0 < fVar226)) goto LAB_01a9dc25;
                    auVar189._4_12_ = SUB1612(ZEXT816(0),0);
                    auVar189._0_4_ = local_740._0_4_;
                    auVar72 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar189);
                    fVar206 = auVar72._0_4_;
                    pGVar1 = (context->scene->geometries).items[local_878].ptr;
                    if ((pGVar1->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar60 = 1, pGVar1->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01a9dc25;
                      fVar206 = fVar206 * 1.5 + local_740._0_4_ * -0.5 * fVar206 * fVar206 * fVar206
                      ;
                      auVar190._0_4_ = local_720._0_4_ * fVar206;
                      auVar190._4_4_ = local_720._4_4_ * fVar206;
                      auVar190._8_4_ = local_720._8_4_ * fVar206;
                      auVar190._12_4_ = local_720._12_4_ * fVar206;
                      auVar73 = vfmadd213ps_fma(auVar71,auVar190,auVar69);
                      auVar71 = vshufps_avx(auVar190,auVar190,0xc9);
                      auVar72 = vshufps_avx(auVar69,auVar69,0xc9);
                      auVar191._0_4_ = auVar190._0_4_ * auVar72._0_4_;
                      auVar191._4_4_ = auVar190._4_4_ * auVar72._4_4_;
                      auVar191._8_4_ = auVar190._8_4_ * auVar72._8_4_;
                      auVar191._12_4_ = auVar190._12_4_ * auVar72._12_4_;
                      auVar79 = vfmsub231ps_fma(auVar191,auVar69,auVar71);
                      auVar71 = vshufps_avx(auVar79,auVar79,0xc9);
                      auVar72 = vshufps_avx(auVar73,auVar73,0xc9);
                      auVar79 = vshufps_avx(auVar79,auVar79,0xd2);
                      auVar144._0_4_ = auVar73._0_4_ * auVar79._0_4_;
                      auVar144._4_4_ = auVar73._4_4_ * auVar79._4_4_;
                      auVar144._8_4_ = auVar73._8_4_ * auVar79._8_4_;
                      auVar144._12_4_ = auVar73._12_4_ * auVar79._12_4_;
                      auVar71 = vfmsub231ps_fma(auVar144,auVar71,auVar72);
                      local_520 = (RTCHitN  [16])vshufps_avx(auVar71,auVar71,0x55);
                      auStack_510 = vshufps_avx(auVar71,auVar71,0xaa);
                      local_500 = auVar71._0_4_;
                      uStack_4fc = local_500;
                      uStack_4f8 = local_500;
                      uStack_4f4 = local_500;
                      local_4f0 = fVar226;
                      fStack_4ec = fVar226;
                      fStack_4e8 = fVar226;
                      fStack_4e4 = fVar226;
                      local_4e0 = ZEXT416(0) << 0x20;
                      local_4d0 = local_530._0_8_;
                      uStack_4c8 = local_530._8_8_;
                      local_4c0 = local_540;
                      vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                      uStack_4ac = context->user->instID[0];
                      local_4b0 = uStack_4ac;
                      uStack_4a8 = uStack_4ac;
                      uStack_4a4 = uStack_4ac;
                      uStack_4a0 = context->user->instPrimID[0];
                      uStack_49c = uStack_4a0;
                      uStack_498 = uStack_4a0;
                      uStack_494 = uStack_4a0;
                      *(float *)(ray + k * 4 + 0x80) = fVar229;
                      local_890 = local_550;
                      local_770.valid = (int *)local_890;
                      local_770.geometryUserPtr = pGVar1->userPtr;
                      local_770.context = context->user;
                      local_770.hit = local_520;
                      local_770.N = 4;
                      local_770.ray = (RTCRayN *)ray;
                      if (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar225 = ZEXT1664(auVar70);
                        auVar228 = ZEXT464((uint)fVar230);
                        auVar232 = ZEXT1664(local_720._0_16_);
                        auVar236 = ZEXT1664(local_740._0_16_);
                        auVar242 = ZEXT1664(auVar69);
                        (*pGVar1->occlusionFilterN)(&local_770);
                        auVar248 = ZEXT3264(local_860);
                        auVar247 = ZEXT3264(local_840);
                        auVar246 = ZEXT3264(local_820);
                      }
                      uVar65 = vptestmd_avx512vl(local_890,local_890);
                      if ((uVar65 & 0xf) != 0) {
                        p_Var2 = context->args->filter;
                        if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar1->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar225 = ZEXT1664(auVar225._0_16_);
                          auVar228 = ZEXT1664(auVar228._0_16_);
                          auVar232 = ZEXT1664(auVar232._0_16_);
                          auVar236 = ZEXT1664(auVar236._0_16_);
                          auVar242 = ZEXT1664(auVar242._0_16_);
                          (*p_Var2)(&local_770);
                          auVar248 = ZEXT3264(local_860);
                          auVar247 = ZEXT3264(local_840);
                          auVar246 = ZEXT3264(local_820);
                        }
                        uVar65 = vptestmd_avx512vl(local_890,local_890);
                        uVar65 = uVar65 & 0xf;
                        auVar71 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar3 = (bool)((byte)uVar65 & 1);
                        bVar4 = (bool)((byte)(uVar65 >> 1) & 1);
                        bVar5 = (bool)((byte)(uVar65 >> 2) & 1);
                        bVar6 = SUB81(uVar65 >> 3,0);
                        *(uint *)(local_770.ray + 0x80) =
                             (uint)bVar3 * auVar71._0_4_ |
                             (uint)!bVar3 * *(int *)(local_770.ray + 0x80);
                        *(uint *)(local_770.ray + 0x84) =
                             (uint)bVar4 * auVar71._4_4_ |
                             (uint)!bVar4 * *(int *)(local_770.ray + 0x84);
                        *(uint *)(local_770.ray + 0x88) =
                             (uint)bVar5 * auVar71._8_4_ |
                             (uint)!bVar5 * *(int *)(local_770.ray + 0x88);
                        *(uint *)(local_770.ray + 0x8c) =
                             (uint)bVar6 * auVar71._12_4_ |
                             (uint)!bVar6 * *(int *)(local_770.ray + 0x8c);
                        bVar60 = 1;
                        if ((byte)uVar65 != 0) goto LAB_01a9dc25;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar231;
                    }
                  }
                  bVar60 = 0;
                  goto LAB_01a9dc25;
                }
              }
              uVar66 = uVar66 + 1;
            }
            bVar67 = false;
LAB_01a9dc25:
            bVar61 = bVar61 | bVar67 & bVar60;
            uVar158 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar218._4_4_ = uVar158;
            auVar218._0_4_ = uVar158;
            auVar218._8_4_ = uVar158;
            auVar218._12_4_ = uVar158;
            auVar218._16_4_ = uVar158;
            auVar218._20_4_ = uVar158;
            auVar218._24_4_ = uVar158;
            auVar218._28_4_ = uVar158;
            auVar219 = ZEXT3264(auVar218);
            auVar57._4_4_ = fStack_3bc;
            auVar57._0_4_ = local_3c0;
            auVar57._8_4_ = fStack_3b8;
            auVar57._12_4_ = fStack_3b4;
            auVar57._16_4_ = fStack_3b0;
            auVar57._20_4_ = fStack_3ac;
            auVar57._24_4_ = fStack_3a8;
            auVar57._28_4_ = fStack_3a4;
            uVar12 = vcmpps_avx512vl(auVar218,auVar57,0xd);
          }
          uVar14 = vpcmpd_avx512vl(local_380,local_320,1);
          uVar13 = vpcmpd_avx512vl(local_380,_local_3e0,1);
          auVar171._0_4_ = (float)local_400._0_4_ + (float)local_1c0._0_4_;
          auVar171._4_4_ = (float)local_400._4_4_ + (float)local_1c0._4_4_;
          auVar171._8_4_ = fStack_3f8 + fStack_1b8;
          auVar171._12_4_ = fStack_3f4 + fStack_1b4;
          auVar171._16_4_ = fStack_3f0 + fStack_1b0;
          auVar171._20_4_ = fStack_3ec + fStack_1ac;
          auVar171._24_4_ = fStack_3e8 + fStack_1a8;
          auVar171._28_4_ = fStack_3e4 + fStack_1a4;
          uVar158 = auVar219._0_4_;
          auVar193._4_4_ = uVar158;
          auVar193._0_4_ = uVar158;
          auVar193._8_4_ = uVar158;
          auVar193._12_4_ = uVar158;
          auVar193._16_4_ = uVar158;
          auVar193._20_4_ = uVar158;
          auVar193._24_4_ = uVar158;
          auVar193._28_4_ = uVar158;
          uVar12 = vcmpps_avx512vl(auVar171,auVar193,2);
          bVar64 = (byte)local_86c & (byte)uVar14 & (byte)uVar12;
          auVar205._0_4_ = (float)local_400._0_4_ + (float)local_360._0_4_;
          auVar205._4_4_ = (float)local_400._4_4_ + (float)local_360._4_4_;
          auVar205._8_4_ = fStack_3f8 + fStack_358;
          auVar205._12_4_ = fStack_3f4 + fStack_354;
          auVar205._16_4_ = fStack_3f0 + fStack_350;
          auVar205._20_4_ = fStack_3ec + fStack_34c;
          auVar205._24_4_ = fStack_3e8 + fStack_348;
          auVar205._28_4_ = fStack_3e4 + fStack_344;
          uVar12 = vcmpps_avx512vl(auVar205,auVar193,2);
          bVar59 = bVar59 & (byte)uVar13 & (byte)uVar12 | bVar64;
          if (bVar59 != 0) {
            abStack_180[uVar63 * 0x60] = bVar59;
            bVar67 = (bool)(bVar64 >> 1 & 1);
            bVar3 = (bool)(bVar64 >> 2 & 1);
            bVar4 = (bool)(bVar64 >> 3 & 1);
            bVar5 = (bool)(bVar64 >> 4 & 1);
            bVar6 = (bool)(bVar64 >> 5 & 1);
            bVar7 = (bool)(bVar64 >> 6 & 1);
            auStack_160[uVar63 * 0x18] =
                 (uint)(bVar64 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar64 & 1) * local_360._0_4_;
            auStack_160[uVar63 * 0x18 + 1] =
                 (uint)bVar67 * local_1c0._4_4_ | (uint)!bVar67 * local_360._4_4_;
            auStack_160[uVar63 * 0x18 + 2] =
                 (uint)bVar3 * (int)fStack_1b8 | (uint)!bVar3 * (int)fStack_358;
            auStack_160[uVar63 * 0x18 + 3] =
                 (uint)bVar4 * (int)fStack_1b4 | (uint)!bVar4 * (int)fStack_354;
            auStack_160[uVar63 * 0x18 + 4] =
                 (uint)bVar5 * (int)fStack_1b0 | (uint)!bVar5 * (int)fStack_350;
            auStack_160[uVar63 * 0x18 + 5] =
                 (uint)bVar6 * (int)fStack_1ac | (uint)!bVar6 * (int)fStack_34c;
            auStack_160[uVar63 * 0x18 + 6] =
                 (uint)bVar7 * (int)fStack_1a8 | (uint)!bVar7 * (int)fStack_348;
            auStack_160[uVar63 * 0x18 + 7] =
                 (uint)(bVar64 >> 7) * (int)fStack_1a4 |
                 (uint)!(bool)(bVar64 >> 7) * (int)fStack_344;
            uVar65 = vmovlps_avx(local_390);
            (&uStack_140)[uVar63 * 0xc] = uVar65;
            aiStack_138[uVar63 * 0x18] = local_a40 + 1;
            uVar63 = (ulong)((int)uVar63 + 1);
          }
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          prim = local_780;
        }
        auVar250 = ZEXT3264(auVar93);
        auVar219 = ZEXT3264(_DAT_01f7b040);
      }
    }
    do {
      uVar68 = (uint)uVar63;
      uVar63 = (ulong)(uVar68 - 1);
      if (uVar68 == 0) {
        if (bVar61 != 0) goto LAB_01a9e215;
        uVar158 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar29._4_4_ = uVar158;
        auVar29._0_4_ = uVar158;
        auVar29._8_4_ = uVar158;
        auVar29._12_4_ = uVar158;
        auVar29._16_4_ = uVar158;
        auVar29._20_4_ = uVar158;
        auVar29._24_4_ = uVar158;
        auVar29._28_4_ = uVar158;
        uVar12 = vcmpps_avx512vl(local_300,auVar29,2);
        local_778 = (ulong)((uint)local_608 & (uint)uVar12);
        goto LAB_01a9b871;
      }
      auVar93 = *(undefined1 (*) [32])(auStack_160 + uVar63 * 0x18);
      auVar172._0_4_ = auVar93._0_4_ + (float)local_400._0_4_;
      auVar172._4_4_ = auVar93._4_4_ + (float)local_400._4_4_;
      auVar172._8_4_ = auVar93._8_4_ + fStack_3f8;
      auVar172._12_4_ = auVar93._12_4_ + fStack_3f4;
      auVar172._16_4_ = auVar93._16_4_ + fStack_3f0;
      auVar172._20_4_ = auVar93._20_4_ + fStack_3ec;
      auVar172._24_4_ = auVar93._24_4_ + fStack_3e8;
      auVar172._28_4_ = auVar93._28_4_ + fStack_3e4;
      uVar158 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar28._4_4_ = uVar158;
      auVar28._0_4_ = uVar158;
      auVar28._8_4_ = uVar158;
      auVar28._12_4_ = uVar158;
      auVar28._16_4_ = uVar158;
      auVar28._20_4_ = uVar158;
      auVar28._24_4_ = uVar158;
      auVar28._28_4_ = uVar158;
      uVar12 = vcmpps_avx512vl(auVar172,auVar28,2);
      uVar129 = (uint)uVar12 & (uint)abStack_180[uVar63 * 0x60];
    } while (uVar129 == 0);
    uVar65 = (&uStack_140)[uVar63 * 0xc];
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar65;
    auVar194._8_4_ = 0x7f800000;
    auVar194._0_8_ = 0x7f8000007f800000;
    auVar194._12_4_ = 0x7f800000;
    auVar194._16_4_ = 0x7f800000;
    auVar194._20_4_ = 0x7f800000;
    auVar194._24_4_ = 0x7f800000;
    auVar194._28_4_ = 0x7f800000;
    auVar82 = vblendmps_avx512vl(auVar194,auVar93);
    bVar59 = (byte)uVar129;
    auVar128._0_4_ =
         (uint)(bVar59 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar59 & 1) * (int)auVar93._0_4_;
    bVar67 = (bool)((byte)(uVar129 >> 1) & 1);
    auVar128._4_4_ = (uint)bVar67 * auVar82._4_4_ | (uint)!bVar67 * (int)auVar93._4_4_;
    bVar67 = (bool)((byte)(uVar129 >> 2) & 1);
    auVar128._8_4_ = (uint)bVar67 * auVar82._8_4_ | (uint)!bVar67 * (int)auVar93._8_4_;
    bVar67 = (bool)((byte)(uVar129 >> 3) & 1);
    auVar128._12_4_ = (uint)bVar67 * auVar82._12_4_ | (uint)!bVar67 * (int)auVar93._12_4_;
    bVar67 = (bool)((byte)(uVar129 >> 4) & 1);
    auVar128._16_4_ = (uint)bVar67 * auVar82._16_4_ | (uint)!bVar67 * (int)auVar93._16_4_;
    bVar67 = (bool)((byte)(uVar129 >> 5) & 1);
    auVar128._20_4_ = (uint)bVar67 * auVar82._20_4_ | (uint)!bVar67 * (int)auVar93._20_4_;
    bVar67 = (bool)((byte)(uVar129 >> 6) & 1);
    auVar128._24_4_ = (uint)bVar67 * auVar82._24_4_ | (uint)!bVar67 * (int)auVar93._24_4_;
    auVar128._28_4_ =
         (uVar129 >> 7) * auVar82._28_4_ | (uint)!SUB41(uVar129 >> 7,0) * (int)auVar93._28_4_;
    auVar93 = vshufps_avx(auVar128,auVar128,0xb1);
    auVar93 = vminps_avx(auVar128,auVar93);
    auVar82 = vshufpd_avx(auVar93,auVar93,5);
    auVar93 = vminps_avx(auVar93,auVar82);
    auVar82 = vpermpd_avx2(auVar93,0x4e);
    auVar93 = vminps_avx(auVar93,auVar82);
    uVar12 = vcmpps_avx512vl(auVar128,auVar93,0);
    bVar64 = (byte)uVar12 & bVar59;
    if (bVar64 != 0) {
      uVar129 = (uint)bVar64;
    }
    uVar130 = 0;
    for (; (uVar129 & 1) == 0; uVar129 = uVar129 >> 1 | 0x80000000) {
      uVar130 = uVar130 + 1;
    }
    local_a40 = aiStack_138[uVar63 * 0x18];
    bVar59 = ~('\x01' << ((byte)uVar130 & 0x1f)) & bVar59;
    abStack_180[uVar63 * 0x60] = bVar59;
    if (bVar59 == 0) {
      uVar68 = uVar68 - 1;
    }
    uVar158 = (undefined4)uVar65;
    auVar151._4_4_ = uVar158;
    auVar151._0_4_ = uVar158;
    auVar151._8_4_ = uVar158;
    auVar151._12_4_ = uVar158;
    auVar151._16_4_ = uVar158;
    auVar151._20_4_ = uVar158;
    auVar151._24_4_ = uVar158;
    auVar151._28_4_ = uVar158;
    auVar71 = vmovshdup_avx(auVar169);
    auVar71 = vsubps_avx(auVar71,auVar169);
    auVar173._0_4_ = auVar71._0_4_;
    auVar173._4_4_ = auVar173._0_4_;
    auVar173._8_4_ = auVar173._0_4_;
    auVar173._12_4_ = auVar173._0_4_;
    auVar173._16_4_ = auVar173._0_4_;
    auVar173._20_4_ = auVar173._0_4_;
    auVar173._24_4_ = auVar173._0_4_;
    auVar173._28_4_ = auVar173._0_4_;
    auVar71 = vfmadd132ps_fma(auVar173,auVar151,auVar219._0_32_);
    _local_520 = ZEXT1632(auVar71);
    local_390._8_8_ = 0;
    local_390._0_8_ = *(ulong *)(local_520 + (ulong)uVar130 * 4);
    uVar63 = (ulong)uVar68;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }